

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersector1<4>::
     intersect_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  ulong uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  uint uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  undefined4 uVar70;
  undefined8 unaff_R13;
  bool bVar71;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar77 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar81 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar120;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar121;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar122;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar126;
  float fVar145;
  vint4 ai;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar147;
  float fVar148;
  float fVar150;
  undefined1 auVar135 [32];
  float fVar146;
  undefined1 auVar136 [32];
  float fVar149;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar132 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar151;
  float fVar172;
  float fVar174;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar152;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar181;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar182;
  float fVar201;
  float fVar202;
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar207;
  undefined1 auVar194 [28];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar208;
  float fVar209;
  float fVar224;
  float fVar226;
  vint4 ai_2;
  undefined1 auVar210 [16];
  float fVar228;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar225;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar233;
  float fVar246;
  float fVar248;
  vint4 ai_1;
  undefined1 auVar235 [16];
  float fVar250;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar234;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar247;
  float fVar249;
  float fVar251;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar245 [64];
  float fVar266;
  float fVar267;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar257 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar268;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar272;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar273 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [28];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  float fVar288;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  float fVar301;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar313;
  float fVar314;
  float fVar318;
  float fVar320;
  undefined1 auVar315 [16];
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar329;
  float fVar330;
  undefined1 auVar316 [32];
  float fVar324;
  float fVar326;
  float fVar328;
  undefined1 auVar317 [64];
  float fVar331;
  float fVar337;
  float fVar338;
  undefined1 auVar332 [16];
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar333 [32];
  float fVar339;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar343;
  float fVar346;
  float fVar347;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b2c;
  float local_b20;
  RTCFilterFunctionNArguments local_ad8;
  int local_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined8 local_970;
  float local_968;
  float local_964;
  undefined4 local_960;
  uint local_95c;
  uint local_958;
  uint local_954;
  uint local_950;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  Primitive *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar6 = prim[1];
  uVar63 = (ulong)(byte)PVar6;
  fVar208 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar238 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar255._0_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar255._4_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar255._8_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar255._12_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar94._0_4_ = fVar208 * auVar238._0_4_;
  auVar94._4_4_ = fVar208 * auVar238._4_4_;
  auVar94._8_4_ = fVar208 * auVar238._8_4_;
  auVar94._12_4_ = fVar208 * auVar238._12_4_;
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar238 = vcvtdq2ps_avx(auVar238);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xc + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xd + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x12 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x13 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x14 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar72 = vshufps_avx(auVar255,auVar255,0);
  auVar95 = vshufps_avx(auVar255,auVar255,0x55);
  auVar127 = vshufps_avx(auVar255,auVar255,0xaa);
  fVar208 = auVar127._0_4_;
  fVar151 = auVar127._4_4_;
  fVar224 = auVar127._8_4_;
  fVar172 = auVar127._12_4_;
  fVar233 = auVar95._0_4_;
  fVar246 = auVar95._4_4_;
  fVar248 = auVar95._8_4_;
  fVar250 = auVar95._12_4_;
  fVar226 = auVar72._0_4_;
  fVar174 = auVar72._4_4_;
  fVar228 = auVar72._8_4_;
  fVar176 = auVar72._12_4_;
  auVar315._0_4_ = fVar226 * auVar84._0_4_ + fVar233 * auVar238._0_4_ + fVar208 * auVar10._0_4_;
  auVar315._4_4_ = fVar174 * auVar84._4_4_ + fVar246 * auVar238._4_4_ + fVar151 * auVar10._4_4_;
  auVar315._8_4_ = fVar228 * auVar84._8_4_ + fVar248 * auVar238._8_4_ + fVar224 * auVar10._8_4_;
  auVar315._12_4_ = fVar176 * auVar84._12_4_ + fVar250 * auVar238._12_4_ + fVar172 * auVar10._12_4_;
  auVar332._0_4_ = fVar226 * auVar79._0_4_ + fVar233 * auVar130._0_4_ + auVar157._0_4_ * fVar208;
  auVar332._4_4_ = fVar174 * auVar79._4_4_ + fVar246 * auVar130._4_4_ + auVar157._4_4_ * fVar151;
  auVar332._8_4_ = fVar228 * auVar79._8_4_ + fVar248 * auVar130._8_4_ + auVar157._8_4_ * fVar224;
  auVar332._12_4_ = fVar176 * auVar79._12_4_ + fVar250 * auVar130._12_4_ + auVar157._12_4_ * fVar172
  ;
  auVar256._0_4_ = fVar226 * auVar73._0_4_ + fVar233 * auVar74._0_4_ + auVar81._0_4_ * fVar208;
  auVar256._4_4_ = fVar174 * auVar73._4_4_ + fVar246 * auVar74._4_4_ + auVar81._4_4_ * fVar151;
  auVar256._8_4_ = fVar228 * auVar73._8_4_ + fVar248 * auVar74._8_4_ + auVar81._8_4_ * fVar224;
  auVar256._12_4_ = fVar176 * auVar73._12_4_ + fVar250 * auVar74._12_4_ + auVar81._12_4_ * fVar172;
  auVar72 = vshufps_avx(auVar94,auVar94,0);
  auVar95 = vshufps_avx(auVar94,auVar94,0x55);
  auVar127 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar208 = auVar127._0_4_;
  fVar151 = auVar127._4_4_;
  fVar224 = auVar127._8_4_;
  fVar172 = auVar127._12_4_;
  fVar233 = auVar95._0_4_;
  fVar246 = auVar95._4_4_;
  fVar248 = auVar95._8_4_;
  fVar250 = auVar95._12_4_;
  fVar226 = auVar72._0_4_;
  fVar174 = auVar72._4_4_;
  fVar228 = auVar72._8_4_;
  fVar176 = auVar72._12_4_;
  auVar183._0_4_ = fVar226 * auVar84._0_4_ + fVar233 * auVar238._0_4_ + fVar208 * auVar10._0_4_;
  auVar183._4_4_ = fVar174 * auVar84._4_4_ + fVar246 * auVar238._4_4_ + fVar151 * auVar10._4_4_;
  auVar183._8_4_ = fVar228 * auVar84._8_4_ + fVar248 * auVar238._8_4_ + fVar224 * auVar10._8_4_;
  auVar183._12_4_ = fVar176 * auVar84._12_4_ + fVar250 * auVar238._12_4_ + fVar172 * auVar10._12_4_;
  auVar95._0_4_ = fVar226 * auVar79._0_4_ + auVar157._0_4_ * fVar208 + fVar233 * auVar130._0_4_;
  auVar95._4_4_ = fVar174 * auVar79._4_4_ + auVar157._4_4_ * fVar151 + fVar246 * auVar130._4_4_;
  auVar95._8_4_ = fVar228 * auVar79._8_4_ + auVar157._8_4_ * fVar224 + fVar248 * auVar130._8_4_;
  auVar95._12_4_ = fVar176 * auVar79._12_4_ + auVar157._12_4_ * fVar172 + fVar250 * auVar130._12_4_;
  auVar72._0_4_ = fVar233 * auVar74._0_4_ + auVar81._0_4_ * fVar208 + fVar226 * auVar73._0_4_;
  auVar72._4_4_ = fVar246 * auVar74._4_4_ + auVar81._4_4_ * fVar151 + fVar174 * auVar73._4_4_;
  auVar72._8_4_ = fVar248 * auVar74._8_4_ + auVar81._8_4_ * fVar224 + fVar228 * auVar73._8_4_;
  auVar72._12_4_ = fVar250 * auVar74._12_4_ + auVar81._12_4_ * fVar172 + fVar176 * auVar73._12_4_;
  auVar235._8_4_ = 0x7fffffff;
  auVar235._0_8_ = 0x7fffffff7fffffff;
  auVar235._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar315,auVar235);
  auVar153._8_4_ = 0x219392ef;
  auVar153._0_8_ = 0x219392ef219392ef;
  auVar153._12_4_ = 0x219392ef;
  auVar84 = vcmpps_avx(auVar84,auVar153,1);
  auVar238 = vblendvps_avx(auVar315,auVar153,auVar84);
  auVar84 = vandps_avx(auVar332,auVar235);
  auVar84 = vcmpps_avx(auVar84,auVar153,1);
  auVar10 = vblendvps_avx(auVar332,auVar153,auVar84);
  auVar84 = vandps_avx(auVar256,auVar235);
  auVar84 = vcmpps_avx(auVar84,auVar153,1);
  auVar84 = vblendvps_avx(auVar256,auVar153,auVar84);
  auVar79 = vrcpps_avx(auVar238);
  fVar233 = auVar79._0_4_;
  auVar127._0_4_ = fVar233 * auVar238._0_4_;
  fVar246 = auVar79._4_4_;
  auVar127._4_4_ = fVar246 * auVar238._4_4_;
  fVar248 = auVar79._8_4_;
  auVar127._8_4_ = fVar248 * auVar238._8_4_;
  fVar250 = auVar79._12_4_;
  auVar127._12_4_ = fVar250 * auVar238._12_4_;
  auVar257._8_4_ = 0x3f800000;
  auVar257._0_8_ = 0x3f8000003f800000;
  auVar257._12_4_ = 0x3f800000;
  auVar238 = vsubps_avx(auVar257,auVar127);
  fVar233 = fVar233 + fVar233 * auVar238._0_4_;
  fVar246 = fVar246 + fVar246 * auVar238._4_4_;
  fVar248 = fVar248 + fVar248 * auVar238._8_4_;
  fVar250 = fVar250 + fVar250 * auVar238._12_4_;
  auVar238 = vrcpps_avx(auVar10);
  fVar208 = auVar238._0_4_;
  auVar210._0_4_ = fVar208 * auVar10._0_4_;
  fVar224 = auVar238._4_4_;
  auVar210._4_4_ = fVar224 * auVar10._4_4_;
  fVar226 = auVar238._8_4_;
  auVar210._8_4_ = fVar226 * auVar10._8_4_;
  fVar228 = auVar238._12_4_;
  auVar210._12_4_ = fVar228 * auVar10._12_4_;
  auVar238 = vsubps_avx(auVar257,auVar210);
  fVar208 = fVar208 + fVar208 * auVar238._0_4_;
  fVar224 = fVar224 + fVar224 * auVar238._4_4_;
  fVar226 = fVar226 + fVar226 * auVar238._8_4_;
  fVar228 = fVar228 + fVar228 * auVar238._12_4_;
  auVar238 = vrcpps_avx(auVar84);
  fVar151 = auVar238._0_4_;
  auVar154._0_4_ = fVar151 * auVar84._0_4_;
  fVar172 = auVar238._4_4_;
  auVar154._4_4_ = fVar172 * auVar84._4_4_;
  fVar174 = auVar238._8_4_;
  auVar154._8_4_ = fVar174 * auVar84._8_4_;
  fVar176 = auVar238._12_4_;
  auVar154._12_4_ = fVar176 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar257,auVar154);
  fVar151 = fVar151 + fVar151 * auVar84._0_4_;
  fVar172 = fVar172 + fVar172 * auVar84._4_4_;
  fVar174 = fVar174 + fVar174 * auVar84._8_4_;
  fVar176 = fVar176 + fVar176 * auVar84._12_4_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar10 = vsubps_avx(auVar84,auVar183);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar84 = vpmovsxwd_avx(auVar238);
  auVar128._0_4_ = fVar233 * auVar10._0_4_;
  auVar128._4_4_ = fVar246 * auVar10._4_4_;
  auVar128._8_4_ = fVar248 * auVar10._8_4_;
  auVar128._12_4_ = fVar250 * auVar10._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar183);
  auVar184._0_4_ = fVar233 * auVar84._0_4_;
  auVar184._4_4_ = fVar246 * auVar84._4_4_;
  auVar184._8_4_ = fVar248 * auVar84._8_4_;
  auVar184._12_4_ = fVar250 * auVar84._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar63 * 0xe + 6);
  auVar84 = vpmovsxwd_avx(auVar10);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar238 = vsubps_avx(auVar84,auVar95);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar84 = vpmovsxwd_avx(auVar79);
  auVar236._0_4_ = auVar238._0_4_ * fVar208;
  auVar236._4_4_ = auVar238._4_4_ * fVar224;
  auVar236._8_4_ = auVar238._8_4_ * fVar226;
  auVar236._12_4_ = auVar238._12_4_ * fVar228;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar95);
  auVar81._0_4_ = fVar208 * auVar84._0_4_;
  auVar81._4_4_ = fVar224 * auVar84._4_4_;
  auVar81._8_4_ = fVar226 * auVar84._8_4_;
  auVar81._12_4_ = fVar228 * auVar84._12_4_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar63 * 0x15 + 6);
  auVar84 = vpmovsxwd_avx(auVar130);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar72);
  auVar211._0_4_ = auVar84._0_4_ * fVar151;
  auVar211._4_4_ = auVar84._4_4_ * fVar172;
  auVar211._8_4_ = auVar84._8_4_ * fVar174;
  auVar211._12_4_ = auVar84._12_4_ * fVar176;
  local_7c8 = prim;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar84 = vpmovsxwd_avx(auVar157);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar72);
  auVar73._0_4_ = auVar84._0_4_ * fVar151;
  auVar73._4_4_ = auVar84._4_4_ * fVar172;
  auVar73._8_4_ = auVar84._8_4_ * fVar174;
  auVar73._12_4_ = auVar84._12_4_ * fVar176;
  auVar84 = vpminsd_avx(auVar128,auVar184);
  auVar238 = vpminsd_avx(auVar236,auVar81);
  auVar84 = vmaxps_avx(auVar84,auVar238);
  auVar238 = vpminsd_avx(auVar211,auVar73);
  uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar281._4_4_ = uVar70;
  auVar281._0_4_ = uVar70;
  auVar281._8_4_ = uVar70;
  auVar281._12_4_ = uVar70;
  auVar238 = vmaxps_avx(auVar238,auVar281);
  auVar84 = vmaxps_avx(auVar84,auVar238);
  local_5c0._0_4_ = auVar84._0_4_ * 0.99999964;
  local_5c0._4_4_ = auVar84._4_4_ * 0.99999964;
  local_5c0._8_4_ = auVar84._8_4_ * 0.99999964;
  local_5c0._12_4_ = auVar84._12_4_ * 0.99999964;
  auVar84 = vpmaxsd_avx(auVar128,auVar184);
  auVar238 = vpmaxsd_avx(auVar236,auVar81);
  auVar84 = vminps_avx(auVar84,auVar238);
  auVar238 = vpmaxsd_avx(auVar211,auVar73);
  fVar208 = (ray->super_RayK<1>).tfar;
  auVar129._4_4_ = fVar208;
  auVar129._0_4_ = fVar208;
  auVar129._8_4_ = fVar208;
  auVar129._12_4_ = fVar208;
  auVar238 = vminps_avx(auVar238,auVar129);
  auVar84 = vminps_avx(auVar84,auVar238);
  auVar74._0_4_ = auVar84._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar84._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar84._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar84._12_4_ * 1.0000004;
  auVar84 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar238 = vpcmpgtd_avx(auVar84,_DAT_01f4ad30);
  auVar84 = vcmpps_avx(local_5c0,auVar74,2);
  auVar84 = vandps_avx(auVar84,auVar238);
  auVar107._16_16_ = mm_lookupmask_ps._240_16_;
  auVar107._0_16_ = mm_lookupmask_ps._240_16_;
  uVar70 = vmovmskps_avx(auVar84);
  uVar63 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar70);
  local_340 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
LAB_007d56a9:
  if (uVar63 == 0) {
    return;
  }
  lVar64 = 0;
  if (uVar63 != 0) {
    for (; (uVar63 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
    }
  }
  uVar67 = *(uint *)(local_7c8 + 2);
  pGVar7 = (context->scene->geometries).items[uVar67].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_7c8 + lVar64 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar84 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar65);
  auVar238 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * (uVar65 + 1));
  pfVar1 = (float *)(pGVar7[2].intersectionFilterN + uVar65 * (long)pGVar7[2].pointQueryFunc);
  auVar185._0_4_ = auVar84._0_4_ + *pfVar1 * 0.33333334;
  auVar185._4_4_ = auVar84._4_4_ + pfVar1[1] * 0.33333334;
  auVar185._8_4_ = auVar84._8_4_ + pfVar1[2] * 0.33333334;
  auVar185._12_4_ = auVar84._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * (uVar65 + 1));
  auVar75._0_4_ = *pfVar1 * 0.33333334;
  auVar75._4_4_ = pfVar1[1] * 0.33333334;
  auVar75._8_4_ = pfVar1[2] * 0.33333334;
  auVar75._12_4_ = pfVar1[3] * 0.33333334;
  auVar157 = vsubps_avx(auVar238,auVar75);
  auVar76._0_4_ = (auVar238._0_4_ + auVar84._0_4_ + auVar185._0_4_ + auVar157._0_4_) * 0.25;
  auVar76._4_4_ = (auVar238._4_4_ + auVar84._4_4_ + auVar185._4_4_ + auVar157._4_4_) * 0.25;
  auVar76._8_4_ = (auVar238._8_4_ + auVar84._8_4_ + auVar185._8_4_ + auVar157._8_4_) * 0.25;
  auVar76._12_4_ = (auVar238._12_4_ + auVar84._12_4_ + auVar185._12_4_ + auVar157._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar10 = vsubps_avx(auVar76,(undefined1  [16])aVar3);
  auVar10 = vdpps_avx(auVar10,(undefined1  [16])aVar4,0x7f);
  auVar79 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar130 = vrcpss_avx(auVar79,auVar79);
  fVar208 = auVar10._0_4_ * auVar130._0_4_ * (2.0 - auVar130._0_4_ * auVar79._0_4_);
  local_7e0 = ZEXT416((uint)fVar208);
  auVar79 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
  fVar208 = aVar4.x;
  fVar151 = aVar4.y;
  fVar224 = aVar4.z;
  aVar121 = aVar4.field_3;
  auVar237._0_4_ = aVar3.x + fVar208 * auVar79._0_4_;
  auVar237._4_4_ = aVar3.y + fVar151 * auVar79._4_4_;
  auVar237._8_4_ = aVar3.z + fVar224 * auVar79._8_4_;
  auVar237._12_4_ = aVar3.field_3.w + aVar121.w * auVar79._12_4_;
  auVar10 = vblendps_avx(auVar237,_DAT_01f45a50,8);
  _local_a10 = vsubps_avx(auVar84,auVar10);
  _local_a20 = vsubps_avx(auVar157,auVar10);
  _local_a30 = vsubps_avx(auVar185,auVar10);
  _local_a40 = vsubps_avx(auVar238,auVar10);
  auVar245 = ZEXT1664(_local_a40);
  auVar84 = vshufps_avx(_local_a10,_local_a10,0);
  auVar260._16_16_ = auVar84;
  auVar260._0_16_ = auVar84;
  auVar84 = vshufps_avx(_local_a10,_local_a10,0x55);
  auVar136._16_16_ = auVar84;
  auVar136._0_16_ = auVar84;
  auVar84 = vshufps_avx(_local_a10,_local_a10,0xaa);
  local_8c0._16_16_ = auVar84;
  local_8c0._0_16_ = auVar84;
  auVar317 = ZEXT3264(local_8c0);
  auVar84 = vshufps_avx(_local_a10,_local_a10,0xff);
  auVar286._16_16_ = auVar84;
  auVar286._0_16_ = auVar84;
  auVar84 = vshufps_avx(_local_a30,_local_a30,0);
  auVar283._16_16_ = auVar84;
  auVar283._0_16_ = auVar84;
  auVar84 = vshufps_avx(_local_a30,_local_a30,0x55);
  auVar333._16_16_ = auVar84;
  auVar333._0_16_ = auVar84;
  auVar84 = vshufps_avx(_local_a30,_local_a30,0xaa);
  auVar344._16_16_ = auVar84;
  auVar344._0_16_ = auVar84;
  auVar96._0_4_ = fVar208 * fVar208;
  auVar96._4_4_ = fVar151 * fVar151;
  auVar96._8_4_ = fVar224 * fVar224;
  auVar96._12_4_ = aVar121.w * aVar121.w;
  auVar84 = vshufps_avx(auVar96,auVar96,0xaa);
  auVar238 = vshufps_avx(auVar96,auVar96,0x55);
  auVar10 = vshufps_avx(_local_a30,_local_a30,0xff);
  local_7c0._16_16_ = auVar10;
  local_7c0._0_16_ = auVar10;
  auVar10 = vshufps_avx(auVar96,auVar96,0);
  local_1e0._0_4_ = auVar10._0_4_ + auVar238._0_4_ + auVar84._0_4_;
  local_1e0._4_4_ = auVar10._4_4_ + auVar238._4_4_ + auVar84._4_4_;
  local_1e0._8_4_ = auVar10._8_4_ + auVar238._8_4_ + auVar84._8_4_;
  local_1e0._12_4_ = auVar10._12_4_ + auVar238._12_4_ + auVar84._12_4_;
  local_1e0._16_4_ = auVar10._0_4_ + auVar238._0_4_ + auVar84._0_4_;
  local_1e0._20_4_ = auVar10._4_4_ + auVar238._4_4_ + auVar84._4_4_;
  local_1e0._24_4_ = auVar10._8_4_ + auVar238._8_4_ + auVar84._8_4_;
  local_1e0._28_4_ = auVar10._12_4_ + auVar238._12_4_ + auVar84._12_4_;
  auVar84 = vshufps_avx(_local_a20,_local_a20,0);
  register0x00001250 = auVar84;
  _local_200 = auVar84;
  auVar84 = vshufps_avx(_local_a20,_local_a20,0x55);
  local_3a0._16_16_ = auVar84;
  local_3a0._0_16_ = auVar84;
  auVar84 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001250 = auVar84;
  _local_220 = auVar84;
  auVar84 = vshufps_avx(_local_a20,_local_a20,0xff);
  register0x00001250 = auVar84;
  _local_240 = auVar84;
  auVar84 = vshufps_avx(_local_a40,_local_a40,0);
  register0x00001250 = auVar84;
  _local_260 = auVar84;
  auVar84 = vshufps_avx(_local_a40,_local_a40,0x55);
  register0x00001250 = auVar84;
  _local_280 = auVar84;
  auVar84 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001250 = auVar84;
  _local_2a0 = auVar84;
  auVar84 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001250 = auVar84;
  _local_2c0 = auVar84;
  register0x00001210 = auVar79;
  _local_660 = auVar79;
  uVar69 = 0;
  local_b2c = 1;
  local_4c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4bc = local_4c0;
  fStack_4b8 = local_4c0;
  fStack_4b4 = local_4c0;
  fStack_4b0 = local_4c0;
  fStack_4ac = local_4c0;
  fStack_4a8 = local_4c0;
  fStack_4a4 = local_4c0;
  local_760 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_75c = local_760;
  fStack_758 = local_760;
  fStack_754 = local_760;
  fStack_750 = local_760;
  fStack_74c = local_760;
  fStack_748 = local_760;
  fStack_744 = local_760;
  local_780 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_77c = local_780;
  fStack_778 = local_780;
  fStack_774 = local_780;
  fStack_770 = local_780;
  fStack_76c = local_780;
  fStack_768 = local_780;
  fStack_764 = local_780;
  auVar169._8_4_ = 0x7fffffff;
  auVar169._0_8_ = 0x7fffffff7fffffff;
  auVar169._12_4_ = 0x7fffffff;
  auVar169._16_4_ = 0x7fffffff;
  auVar169._20_4_ = 0x7fffffff;
  auVar169._24_4_ = 0x7fffffff;
  auVar169._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_1e0,auVar169);
  local_5b0 = ZEXT816(0x3f80000000000000);
  local_880 = auVar260;
  local_8a0 = auVar136;
  local_8e0 = auVar286;
  local_4e0 = auVar283;
  local_360 = auVar333;
  local_380 = auVar344;
  uVar65 = (ulong)*(uint *)(local_7c8 + lVar64 * 4 + 6);
  do {
    auVar84 = vmovshdup_avx(local_5b0);
    auVar10 = vsubps_avx(auVar84,local_5b0);
    auVar84 = vshufps_avx(local_5b0,local_5b0,0);
    local_820._16_16_ = auVar84;
    local_820._0_16_ = auVar84;
    auVar238 = vshufps_avx(auVar10,auVar10,0);
    local_6e0._16_16_ = auVar238;
    local_6e0._0_16_ = auVar238;
    fVar151 = auVar238._0_4_;
    fVar228 = auVar238._4_4_;
    fVar250 = auVar238._8_4_;
    fVar126 = auVar238._12_4_;
    fVar149 = auVar84._0_4_;
    auVar108._0_4_ = fVar149 + fVar151 * 0.0;
    fVar343 = auVar84._4_4_;
    auVar108._4_4_ = fVar343 + fVar228 * 0.14285715;
    fVar346 = auVar84._8_4_;
    auVar108._8_4_ = fVar346 + fVar250 * 0.2857143;
    fVar347 = auVar84._12_4_;
    auVar108._12_4_ = fVar347 + fVar126 * 0.42857146;
    auVar108._16_4_ = fVar149 + fVar151 * 0.5714286;
    auVar108._20_4_ = fVar343 + fVar228 * 0.71428573;
    auVar108._24_4_ = fVar346 + fVar250 * 0.8571429;
    auVar108._28_4_ = fVar347 + fVar126;
    auVar135._8_4_ = 0x3f800000;
    auVar135._0_8_ = 0x3f8000003f800000;
    auVar135._12_4_ = 0x3f800000;
    auVar135._16_4_ = 0x3f800000;
    auVar135._20_4_ = 0x3f800000;
    auVar135._24_4_ = 0x3f800000;
    auVar135._28_4_ = 0x3f800000;
    auVar107 = vsubps_avx(auVar135,auVar108);
    fVar246 = auVar283._28_4_;
    fVar248 = auVar333._28_4_;
    fVar208 = auVar107._0_4_;
    fVar224 = auVar107._4_4_;
    fVar172 = auVar107._8_4_;
    fVar226 = auVar107._12_4_;
    fVar174 = auVar107._16_4_;
    fVar176 = auVar107._20_4_;
    fVar233 = auVar107._24_4_;
    fVar280 = fVar248 + fVar246;
    fVar234 = (float)local_200._0_4_ * auVar108._0_4_ + auVar283._0_4_ * fVar208;
    fVar247 = (float)local_200._4_4_ * auVar108._4_4_ + auVar283._4_4_ * fVar224;
    fVar249 = fStack_1f8 * auVar108._8_4_ + auVar283._8_4_ * fVar172;
    fVar251 = fStack_1f4 * auVar108._12_4_ + auVar283._12_4_ * fVar226;
    fVar252 = fStack_1f0 * auVar108._16_4_ + auVar283._16_4_ * fVar174;
    fVar253 = fStack_1ec * auVar108._20_4_ + auVar283._20_4_ * fVar176;
    fVar254 = fStack_1e8 * auVar108._24_4_ + auVar283._24_4_ * fVar233;
    fVar152 = local_3a0._0_4_ * auVar108._0_4_ + auVar333._0_4_ * fVar208;
    fVar173 = local_3a0._4_4_ * auVar108._4_4_ + auVar333._4_4_ * fVar224;
    fVar175 = local_3a0._8_4_ * auVar108._8_4_ + auVar333._8_4_ * fVar172;
    fVar177 = local_3a0._12_4_ * auVar108._12_4_ + auVar333._12_4_ * fVar226;
    fVar178 = local_3a0._16_4_ * auVar108._16_4_ + auVar333._16_4_ * fVar174;
    fVar179 = local_3a0._20_4_ * auVar108._20_4_ + auVar333._20_4_ * fVar176;
    fVar180 = local_3a0._24_4_ * auVar108._24_4_ + auVar333._24_4_ * fVar233;
    fVar182 = (float)local_220._0_4_ * auVar108._0_4_ + auVar344._0_4_ * fVar208;
    fVar201 = (float)local_220._4_4_ * auVar108._4_4_ + auVar344._4_4_ * fVar224;
    fVar202 = fStack_218 * auVar108._8_4_ + auVar344._8_4_ * fVar172;
    fVar203 = fStack_214 * auVar108._12_4_ + auVar344._12_4_ * fVar226;
    fVar204 = fStack_210 * auVar108._16_4_ + auVar344._16_4_ * fVar174;
    fVar205 = fStack_20c * auVar108._20_4_ + auVar344._20_4_ * fVar176;
    fVar206 = fStack_208 * auVar108._24_4_ + auVar344._24_4_ * fVar233;
    fVar209 = (float)local_240._0_4_ * auVar108._0_4_ + local_7c0._0_4_ * fVar208;
    fVar225 = (float)local_240._4_4_ * auVar108._4_4_ + local_7c0._4_4_ * fVar224;
    fVar227 = fStack_238 * auVar108._8_4_ + local_7c0._8_4_ * fVar172;
    fVar229 = fStack_234 * auVar108._12_4_ + local_7c0._12_4_ * fVar226;
    fVar230 = fStack_230 * auVar108._16_4_ + local_7c0._16_4_ * fVar174;
    fVar231 = fStack_22c * auVar108._20_4_ + local_7c0._20_4_ * fVar176;
    fVar232 = fStack_228 * auVar108._24_4_ + local_7c0._24_4_ * fVar233;
    fVar120 = auVar286._28_4_;
    fVar330 = local_7c0._28_4_ + fVar120;
    auVar284._0_4_ =
         fVar208 * (auVar283._0_4_ * auVar108._0_4_ + auVar260._0_4_ * fVar208) +
         auVar108._0_4_ * fVar234;
    auVar284._4_4_ =
         fVar224 * (auVar283._4_4_ * auVar108._4_4_ + auVar260._4_4_ * fVar224) +
         auVar108._4_4_ * fVar247;
    auVar284._8_4_ =
         fVar172 * (auVar283._8_4_ * auVar108._8_4_ + auVar260._8_4_ * fVar172) +
         auVar108._8_4_ * fVar249;
    auVar284._12_4_ =
         fVar226 * (auVar283._12_4_ * auVar108._12_4_ + auVar260._12_4_ * fVar226) +
         auVar108._12_4_ * fVar251;
    auVar284._16_4_ =
         fVar174 * (auVar283._16_4_ * auVar108._16_4_ + auVar260._16_4_ * fVar174) +
         auVar108._16_4_ * fVar252;
    auVar284._20_4_ =
         fVar176 * (auVar283._20_4_ * auVar108._20_4_ + auVar260._20_4_ * fVar176) +
         auVar108._20_4_ * fVar253;
    auVar284._24_4_ =
         fVar233 * (auVar283._24_4_ * auVar108._24_4_ + auVar260._24_4_ * fVar233) +
         auVar108._24_4_ * fVar254;
    auVar284._28_4_ = local_7c0._28_4_ + fVar120;
    auVar289._0_4_ =
         (auVar333._0_4_ * auVar108._0_4_ + auVar136._0_4_ * fVar208) * fVar208 +
         auVar108._0_4_ * fVar152;
    auVar289._4_4_ =
         (auVar333._4_4_ * auVar108._4_4_ + auVar136._4_4_ * fVar224) * fVar224 +
         auVar108._4_4_ * fVar173;
    auVar289._8_4_ =
         (auVar333._8_4_ * auVar108._8_4_ + auVar136._8_4_ * fVar172) * fVar172 +
         auVar108._8_4_ * fVar175;
    auVar289._12_4_ =
         (auVar333._12_4_ * auVar108._12_4_ + auVar136._12_4_ * fVar226) * fVar226 +
         auVar108._12_4_ * fVar177;
    auVar289._16_4_ =
         (auVar333._16_4_ * auVar108._16_4_ + auVar136._16_4_ * fVar174) * fVar174 +
         auVar108._16_4_ * fVar178;
    auVar289._20_4_ =
         (auVar333._20_4_ * auVar108._20_4_ + auVar136._20_4_ * fVar176) * fVar176 +
         auVar108._20_4_ * fVar179;
    auVar289._24_4_ =
         (auVar333._24_4_ * auVar108._24_4_ + auVar136._24_4_ * fVar233) * fVar233 +
         auVar108._24_4_ * fVar180;
    auVar289._28_4_ = fStack_204 + fVar120;
    auVar302._0_4_ =
         fVar208 * (auVar344._0_4_ * auVar108._0_4_ + auVar317._0_4_ * fVar208) +
         auVar108._0_4_ * fVar182;
    auVar302._4_4_ =
         fVar224 * (auVar344._4_4_ * auVar108._4_4_ + auVar317._4_4_ * fVar224) +
         auVar108._4_4_ * fVar201;
    auVar302._8_4_ =
         fVar172 * (auVar344._8_4_ * auVar108._8_4_ + auVar317._8_4_ * fVar172) +
         auVar108._8_4_ * fVar202;
    auVar302._12_4_ =
         fVar226 * (auVar344._12_4_ * auVar108._12_4_ + auVar317._12_4_ * fVar226) +
         auVar108._12_4_ * fVar203;
    auVar302._16_4_ =
         fVar174 * (auVar344._16_4_ * auVar108._16_4_ + auVar317._16_4_ * fVar174) +
         auVar108._16_4_ * fVar204;
    auVar302._20_4_ =
         fVar176 * (auVar344._20_4_ * auVar108._20_4_ + auVar317._20_4_ * fVar176) +
         auVar108._20_4_ * fVar205;
    auVar302._24_4_ =
         fVar233 * (auVar344._24_4_ * auVar108._24_4_ + auVar317._24_4_ * fVar233) +
         auVar108._24_4_ * fVar206;
    auVar302._28_4_ = fVar280 + fVar120;
    auVar261._0_4_ =
         auVar108._0_4_ * fVar209 +
         fVar208 * (local_7c0._0_4_ * auVar108._0_4_ + auVar286._0_4_ * fVar208);
    auVar261._4_4_ =
         auVar108._4_4_ * fVar225 +
         fVar224 * (local_7c0._4_4_ * auVar108._4_4_ + auVar286._4_4_ * fVar224);
    auVar261._8_4_ =
         auVar108._8_4_ * fVar227 +
         fVar172 * (local_7c0._8_4_ * auVar108._8_4_ + auVar286._8_4_ * fVar172);
    auVar261._12_4_ =
         auVar108._12_4_ * fVar229 +
         fVar226 * (local_7c0._12_4_ * auVar108._12_4_ + auVar286._12_4_ * fVar226);
    auVar261._16_4_ =
         auVar108._16_4_ * fVar230 +
         fVar174 * (local_7c0._16_4_ * auVar108._16_4_ + auVar286._16_4_ * fVar174);
    auVar261._20_4_ =
         auVar108._20_4_ * fVar231 +
         fVar176 * (local_7c0._20_4_ * auVar108._20_4_ + auVar286._20_4_ * fVar176);
    auVar261._24_4_ =
         auVar108._24_4_ * fVar232 +
         fVar233 * (local_7c0._24_4_ * auVar108._24_4_ + auVar286._24_4_ * fVar233);
    auVar261._28_4_ = fVar280 + local_3a0._28_4_;
    auVar241._0_4_ =
         (auVar108._0_4_ * (float)local_260._0_4_ + (float)local_200._0_4_ * fVar208) *
         auVar108._0_4_ + fVar208 * fVar234;
    auVar241._4_4_ =
         (auVar108._4_4_ * (float)local_260._4_4_ + (float)local_200._4_4_ * fVar224) *
         auVar108._4_4_ + fVar224 * fVar247;
    auVar241._8_4_ =
         (auVar108._8_4_ * fStack_258 + fStack_1f8 * fVar172) * auVar108._8_4_ + fVar172 * fVar249;
    auVar241._12_4_ =
         (auVar108._12_4_ * fStack_254 + fStack_1f4 * fVar226) * auVar108._12_4_ + fVar226 * fVar251
    ;
    auVar241._16_4_ =
         (auVar108._16_4_ * fStack_250 + fStack_1f0 * fVar174) * auVar108._16_4_ + fVar174 * fVar252
    ;
    auVar241._20_4_ =
         (auVar108._20_4_ * fStack_24c + fStack_1ec * fVar176) * auVar108._20_4_ + fVar176 * fVar253
    ;
    auVar241._24_4_ =
         (auVar108._24_4_ * fStack_248 + fStack_1e8 * fVar233) * auVar108._24_4_ + fVar233 * fVar254
    ;
    auVar241._28_4_ = fVar280 + fVar246 + auVar245._28_4_;
    auVar167._0_4_ =
         (auVar108._0_4_ * (float)local_280._0_4_ + local_3a0._0_4_ * fVar208) * auVar108._0_4_ +
         fVar208 * fVar152;
    auVar167._4_4_ =
         (auVar108._4_4_ * (float)local_280._4_4_ + local_3a0._4_4_ * fVar224) * auVar108._4_4_ +
         fVar224 * fVar173;
    auVar167._8_4_ =
         (auVar108._8_4_ * fStack_278 + local_3a0._8_4_ * fVar172) * auVar108._8_4_ +
         fVar172 * fVar175;
    auVar167._12_4_ =
         (auVar108._12_4_ * fStack_274 + local_3a0._12_4_ * fVar226) * auVar108._12_4_ +
         fVar226 * fVar177;
    auVar167._16_4_ =
         (auVar108._16_4_ * fStack_270 + local_3a0._16_4_ * fVar174) * auVar108._16_4_ +
         fVar174 * fVar178;
    auVar167._20_4_ =
         (auVar108._20_4_ * fStack_26c + local_3a0._20_4_ * fVar176) * auVar108._20_4_ +
         fVar176 * fVar179;
    auVar167._24_4_ =
         (auVar108._24_4_ * fStack_268 + local_3a0._24_4_ * fVar233) * auVar108._24_4_ +
         fVar233 * fVar180;
    auVar167._28_4_ = fVar280 + fVar248 + fVar246;
    auVar195._0_4_ =
         (auVar108._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar208) *
         auVar108._0_4_ + fVar208 * fVar182;
    auVar195._4_4_ =
         (auVar108._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar224) *
         auVar108._4_4_ + fVar224 * fVar201;
    auVar195._8_4_ =
         (auVar108._8_4_ * fStack_298 + fStack_218 * fVar172) * auVar108._8_4_ + fVar172 * fVar202;
    auVar195._12_4_ =
         (auVar108._12_4_ * fStack_294 + fStack_214 * fVar226) * auVar108._12_4_ + fVar226 * fVar203
    ;
    auVar195._16_4_ =
         (auVar108._16_4_ * fStack_290 + fStack_210 * fVar174) * auVar108._16_4_ + fVar174 * fVar204
    ;
    auVar195._20_4_ =
         (auVar108._20_4_ * fStack_28c + fStack_20c * fVar176) * auVar108._20_4_ + fVar176 * fVar205
    ;
    auVar195._24_4_ =
         (auVar108._24_4_ * fStack_288 + fStack_208 * fVar233) * auVar108._24_4_ + fVar233 * fVar206
    ;
    auVar195._28_4_ = fVar330 + auVar344._28_4_ + fVar248;
    auVar217._0_4_ =
         (auVar108._0_4_ * (float)local_2c0._0_4_ + (float)local_240._0_4_ * fVar208) *
         auVar108._0_4_ + fVar208 * fVar209;
    auVar217._4_4_ =
         (auVar108._4_4_ * (float)local_2c0._4_4_ + (float)local_240._4_4_ * fVar224) *
         auVar108._4_4_ + fVar224 * fVar225;
    auVar217._8_4_ =
         (auVar108._8_4_ * fStack_2b8 + fStack_238 * fVar172) * auVar108._8_4_ + fVar172 * fVar227;
    auVar217._12_4_ =
         (auVar108._12_4_ * fStack_2b4 + fStack_234 * fVar226) * auVar108._12_4_ + fVar226 * fVar229
    ;
    auVar217._16_4_ =
         (auVar108._16_4_ * fStack_2b0 + fStack_230 * fVar174) * auVar108._16_4_ + fVar174 * fVar230
    ;
    auVar217._20_4_ =
         (auVar108._20_4_ * fStack_2ac + fStack_22c * fVar176) * auVar108._20_4_ + fVar176 * fVar231
    ;
    auVar217._24_4_ =
         (auVar108._24_4_ * fStack_2a8 + fStack_228 * fVar233) * auVar108._24_4_ + fVar233 * fVar232
    ;
    auVar217._28_4_ = fVar120 + fVar246 + fVar120 + auVar344._28_4_;
    auVar348._0_4_ = auVar284._0_4_ * fVar208 + auVar108._0_4_ * auVar241._0_4_;
    auVar348._4_4_ = auVar284._4_4_ * fVar224 + auVar108._4_4_ * auVar241._4_4_;
    auVar348._8_4_ = auVar284._8_4_ * fVar172 + auVar108._8_4_ * auVar241._8_4_;
    auVar348._12_4_ = auVar284._12_4_ * fVar226 + auVar108._12_4_ * auVar241._12_4_;
    auVar348._16_4_ = auVar284._16_4_ * fVar174 + auVar108._16_4_ * auVar241._16_4_;
    auVar348._20_4_ = auVar284._20_4_ * fVar176 + auVar108._20_4_ * auVar241._20_4_;
    auVar348._24_4_ = auVar284._24_4_ * fVar233 + auVar108._24_4_ * auVar241._24_4_;
    auVar348._28_4_ = fVar120 + fVar246 + fVar280;
    local_600._0_4_ = auVar289._0_4_ * fVar208 + auVar108._0_4_ * auVar167._0_4_;
    local_600._4_4_ = auVar289._4_4_ * fVar224 + auVar108._4_4_ * auVar167._4_4_;
    local_600._8_4_ = auVar289._8_4_ * fVar172 + auVar108._8_4_ * auVar167._8_4_;
    local_600._12_4_ = auVar289._12_4_ * fVar226 + auVar108._12_4_ * auVar167._12_4_;
    local_600._16_4_ = auVar289._16_4_ * fVar174 + auVar108._16_4_ * auVar167._16_4_;
    local_600._20_4_ = auVar289._20_4_ * fVar176 + auVar108._20_4_ * auVar167._20_4_;
    local_600._24_4_ = auVar289._24_4_ * fVar233 + auVar108._24_4_ * auVar167._24_4_;
    local_600._28_4_ = fVar280 + fVar330;
    local_5e0._0_4_ = auVar302._0_4_ * fVar208 + auVar108._0_4_ * auVar195._0_4_;
    local_5e0._4_4_ = auVar302._4_4_ * fVar224 + auVar108._4_4_ * auVar195._4_4_;
    local_5e0._8_4_ = auVar302._8_4_ * fVar172 + auVar108._8_4_ * auVar195._8_4_;
    local_5e0._12_4_ = auVar302._12_4_ * fVar226 + auVar108._12_4_ * auVar195._12_4_;
    local_5e0._16_4_ = auVar302._16_4_ * fVar174 + auVar108._16_4_ * auVar195._16_4_;
    local_5e0._20_4_ = auVar302._20_4_ * fVar176 + auVar108._20_4_ * auVar195._20_4_;
    local_5e0._24_4_ = auVar302._24_4_ * fVar233 + auVar108._24_4_ * auVar195._24_4_;
    local_5e0._28_4_ = fVar330 + fVar280;
    local_b20 = auVar10._0_4_;
    local_700._0_4_ = fVar208 * auVar261._0_4_ + auVar108._0_4_ * auVar217._0_4_;
    local_700._4_4_ = fVar224 * auVar261._4_4_ + auVar108._4_4_ * auVar217._4_4_;
    local_700._8_4_ = fVar172 * auVar261._8_4_ + auVar108._8_4_ * auVar217._8_4_;
    local_700._12_4_ = fVar226 * auVar261._12_4_ + auVar108._12_4_ * auVar217._12_4_;
    local_700._16_4_ = fVar174 * auVar261._16_4_ + auVar108._16_4_ * auVar217._16_4_;
    local_700._20_4_ = fVar176 * auVar261._20_4_ + auVar108._20_4_ * auVar217._20_4_;
    local_700._24_4_ = fVar233 * auVar261._24_4_ + auVar108._24_4_ * auVar217._24_4_;
    local_700._28_4_ = auVar107._28_4_ + auVar108._28_4_;
    auVar107 = vsubps_avx(auVar241,auVar284);
    auVar283 = vsubps_avx(auVar167,auVar289);
    auVar333 = vsubps_avx(auVar195,auVar302);
    auVar344 = vsubps_avx(auVar217,auVar261);
    auVar84 = vshufps_avx(ZEXT416((uint)(local_b20 * 0.04761905)),
                          ZEXT416((uint)(local_b20 * 0.04761905)),0);
    fVar208 = auVar84._0_4_;
    fVar301 = fVar208 * auVar107._0_4_ * 3.0;
    fVar224 = auVar84._4_4_;
    fVar307 = fVar224 * auVar107._4_4_ * 3.0;
    local_a60._4_4_ = fVar307;
    local_a60._0_4_ = fVar301;
    fVar172 = auVar84._8_4_;
    fVar308 = fVar172 * auVar107._8_4_ * 3.0;
    local_a60._8_4_ = fVar308;
    fVar226 = auVar84._12_4_;
    fVar309 = fVar226 * auVar107._12_4_ * 3.0;
    local_a60._12_4_ = fVar309;
    fVar310 = fVar208 * auVar107._16_4_ * 3.0;
    local_a60._16_4_ = fVar310;
    fVar311 = fVar224 * auVar107._20_4_ * 3.0;
    local_a60._20_4_ = fVar311;
    fVar312 = fVar172 * auVar107._24_4_ * 3.0;
    local_a60._24_4_ = fVar312;
    local_a60._28_4_ = auVar302._28_4_;
    fVar288 = fVar208 * auVar283._0_4_ * 3.0;
    fVar295 = fVar224 * auVar283._4_4_ * 3.0;
    local_800._4_4_ = fVar295;
    local_800._0_4_ = fVar288;
    fVar296 = fVar172 * auVar283._8_4_ * 3.0;
    local_800._8_4_ = fVar296;
    fVar297 = fVar226 * auVar283._12_4_ * 3.0;
    local_800._12_4_ = fVar297;
    fVar298 = fVar208 * auVar283._16_4_ * 3.0;
    local_800._16_4_ = fVar298;
    fVar299 = fVar224 * auVar283._20_4_ * 3.0;
    local_800._20_4_ = fVar299;
    fVar300 = fVar172 * auVar283._24_4_ * 3.0;
    local_800._24_4_ = fVar300;
    local_800._28_4_ = auVar289._28_4_;
    fVar313 = fVar208 * auVar333._0_4_ * 3.0;
    fVar318 = fVar224 * auVar333._4_4_ * 3.0;
    local_860._4_4_ = fVar318;
    local_860._0_4_ = fVar313;
    fVar320 = fVar172 * auVar333._8_4_ * 3.0;
    local_860._8_4_ = fVar320;
    fVar322 = fVar226 * auVar333._12_4_ * 3.0;
    local_860._12_4_ = fVar322;
    fVar324 = fVar208 * auVar333._16_4_ * 3.0;
    local_860._16_4_ = fVar324;
    fVar326 = fVar224 * auVar333._20_4_ * 3.0;
    local_860._20_4_ = fVar326;
    fVar328 = fVar172 * auVar333._24_4_ * 3.0;
    local_860._24_4_ = fVar328;
    local_860._28_4_ = fVar330;
    auVar85._0_4_ = fVar208 * auVar344._0_4_ * 3.0;
    auVar85._4_4_ = fVar224 * auVar344._4_4_ * 3.0;
    auVar85._8_4_ = fVar172 * auVar344._8_4_ * 3.0;
    auVar85._12_4_ = fVar226 * auVar344._12_4_ * 3.0;
    auVar85._16_4_ = fVar208 * auVar344._16_4_ * 3.0;
    auVar85._20_4_ = fVar224 * auVar344._20_4_ * 3.0;
    auVar85._24_4_ = fVar172 * auVar344._24_4_ * 3.0;
    auVar85._28_4_ = 0;
    auVar107 = vperm2f128_avx(local_600,local_600,1);
    auVar107 = vshufps_avx(auVar107,local_600,0x30);
    local_a00 = vshufps_avx(local_600,auVar107,0x29);
    auVar107 = vperm2f128_avx(local_5e0,local_5e0,1);
    auVar107 = vshufps_avx(auVar107,local_5e0,0x30);
    _local_920 = vshufps_avx(local_5e0,auVar107,0x29);
    auVar283 = vsubps_avx(local_700,auVar85);
    auVar107 = vperm2f128_avx(auVar283,auVar283,1);
    auVar107 = vshufps_avx(auVar107,auVar283,0x30);
    auVar344 = vshufps_avx(auVar283,auVar107,0x29);
    local_2e0 = vsubps_avx(local_a00,local_600);
    local_620 = vsubps_avx(_local_920,local_5e0);
    fVar224 = local_2e0._0_4_;
    fVar176 = local_2e0._4_4_;
    auVar11._4_4_ = fVar318 * fVar176;
    auVar11._0_4_ = fVar313 * fVar224;
    fVar152 = local_2e0._8_4_;
    auVar11._8_4_ = fVar320 * fVar152;
    fVar178 = local_2e0._12_4_;
    auVar11._12_4_ = fVar322 * fVar178;
    fVar201 = local_2e0._16_4_;
    auVar11._16_4_ = fVar324 * fVar201;
    fVar205 = local_2e0._20_4_;
    auVar11._20_4_ = fVar326 * fVar205;
    fVar227 = local_2e0._24_4_;
    auVar11._24_4_ = fVar328 * fVar227;
    auVar11._28_4_ = auVar283._28_4_;
    fVar172 = local_620._0_4_;
    fVar233 = local_620._4_4_;
    auVar12._4_4_ = fVar295 * fVar233;
    auVar12._0_4_ = fVar288 * fVar172;
    fVar173 = local_620._8_4_;
    auVar12._8_4_ = fVar296 * fVar173;
    fVar179 = local_620._12_4_;
    auVar12._12_4_ = fVar297 * fVar179;
    fVar202 = local_620._16_4_;
    auVar12._16_4_ = fVar298 * fVar202;
    fVar206 = local_620._20_4_;
    auVar12._20_4_ = fVar299 * fVar206;
    fVar229 = local_620._24_4_;
    auVar12._24_4_ = fVar300 * fVar229;
    auVar12._28_4_ = auVar107._28_4_;
    auVar333 = vsubps_avx(auVar12,auVar11);
    auVar107 = vperm2f128_avx(auVar348,auVar348,1);
    auVar107 = vshufps_avx(auVar107,auVar348,0x30);
    local_9a0 = vshufps_avx(auVar348,auVar107,0x29);
    local_300 = vsubps_avx(local_9a0,auVar348);
    auVar13._4_4_ = fVar307 * fVar233;
    auVar13._0_4_ = fVar301 * fVar172;
    auVar13._8_4_ = fVar308 * fVar173;
    auVar13._12_4_ = fVar309 * fVar179;
    auVar13._16_4_ = fVar310 * fVar202;
    auVar13._20_4_ = fVar311 * fVar206;
    auVar13._24_4_ = fVar312 * fVar229;
    auVar13._28_4_ = local_9a0._28_4_;
    fVar226 = local_300._0_4_;
    fVar246 = local_300._4_4_;
    auVar14._4_4_ = fVar318 * fVar246;
    auVar14._0_4_ = fVar313 * fVar226;
    fVar175 = local_300._8_4_;
    auVar14._8_4_ = fVar320 * fVar175;
    fVar180 = local_300._12_4_;
    auVar14._12_4_ = fVar322 * fVar180;
    fVar203 = local_300._16_4_;
    auVar14._16_4_ = fVar324 * fVar203;
    fVar209 = local_300._20_4_;
    auVar14._20_4_ = fVar326 * fVar209;
    fVar230 = local_300._24_4_;
    auVar14._24_4_ = fVar328 * fVar230;
    auVar14._28_4_ = local_a00._28_4_;
    auVar136 = vsubps_avx(auVar14,auVar13);
    auVar15._4_4_ = fVar295 * fVar246;
    auVar15._0_4_ = fVar288 * fVar226;
    auVar15._8_4_ = fVar296 * fVar175;
    auVar15._12_4_ = fVar297 * fVar180;
    auVar15._16_4_ = fVar298 * fVar203;
    auVar15._20_4_ = fVar299 * fVar209;
    auVar15._24_4_ = fVar300 * fVar230;
    auVar15._28_4_ = local_a00._28_4_;
    auVar16._4_4_ = fVar307 * fVar176;
    auVar16._0_4_ = fVar301 * fVar224;
    auVar16._8_4_ = fVar308 * fVar152;
    auVar16._12_4_ = fVar309 * fVar178;
    auVar16._16_4_ = fVar310 * fVar201;
    auVar16._20_4_ = fVar311 * fVar205;
    auVar16._24_4_ = fVar312 * fVar227;
    auVar16._28_4_ = auVar284._28_4_;
    auVar286 = vsubps_avx(auVar16,auVar15);
    fVar208 = auVar286._28_4_;
    fVar174 = auVar136._28_4_ + fVar208;
    auVar168._0_4_ = fVar226 * fVar226 + fVar224 * fVar224 + fVar172 * fVar172;
    auVar168._4_4_ = fVar246 * fVar246 + fVar176 * fVar176 + fVar233 * fVar233;
    auVar168._8_4_ = fVar175 * fVar175 + fVar152 * fVar152 + fVar173 * fVar173;
    auVar168._12_4_ = fVar180 * fVar180 + fVar178 * fVar178 + fVar179 * fVar179;
    auVar168._16_4_ = fVar203 * fVar203 + fVar201 * fVar201 + fVar202 * fVar202;
    auVar168._20_4_ = fVar209 * fVar209 + fVar205 * fVar205 + fVar206 * fVar206;
    auVar168._24_4_ = fVar230 * fVar230 + fVar227 * fVar227 + fVar229 * fVar229;
    auVar168._28_4_ = fVar208 + fVar208 + fVar174;
    auVar107 = vrcpps_avx(auVar168);
    fVar248 = auVar107._0_4_;
    fVar177 = auVar107._4_4_;
    auVar17._4_4_ = fVar177 * auVar168._4_4_;
    auVar17._0_4_ = fVar248 * auVar168._0_4_;
    fVar182 = auVar107._8_4_;
    auVar17._8_4_ = fVar182 * auVar168._8_4_;
    fVar204 = auVar107._12_4_;
    auVar17._12_4_ = fVar204 * auVar168._12_4_;
    fVar225 = auVar107._16_4_;
    auVar17._16_4_ = fVar225 * auVar168._16_4_;
    fVar231 = auVar107._20_4_;
    auVar17._20_4_ = fVar231 * auVar168._20_4_;
    fVar207 = auVar107._24_4_;
    auVar17._24_4_ = fVar207 * auVar168._24_4_;
    auVar17._28_4_ = auVar284._28_4_;
    auVar86._8_4_ = 0x3f800000;
    auVar86._0_8_ = 0x3f8000003f800000;
    auVar86._12_4_ = 0x3f800000;
    auVar86._16_4_ = 0x3f800000;
    auVar86._20_4_ = 0x3f800000;
    auVar86._24_4_ = 0x3f800000;
    auVar86._28_4_ = 0x3f800000;
    auVar260 = vsubps_avx(auVar86,auVar17);
    fVar248 = auVar260._0_4_ * fVar248 + fVar248;
    fVar177 = auVar260._4_4_ * fVar177 + fVar177;
    fVar182 = auVar260._8_4_ * fVar182 + fVar182;
    fVar204 = auVar260._12_4_ * fVar204 + fVar204;
    fVar225 = auVar260._16_4_ * fVar225 + fVar225;
    fVar231 = auVar260._20_4_ * fVar231 + fVar231;
    fVar207 = auVar260._24_4_ * fVar207 + fVar207;
    auVar283 = vperm2f128_avx(local_800,local_800,1);
    auVar283 = vshufps_avx(auVar283,local_800,0x30);
    local_a80 = vshufps_avx(local_800,auVar283,0x29);
    auVar283 = vperm2f128_avx(local_860,local_860,1);
    auVar283 = vshufps_avx(auVar283,local_860,0x30);
    local_9c0 = vshufps_avx(local_860,auVar283,0x29);
    fVar232 = local_9c0._0_4_;
    fVar234 = local_9c0._4_4_;
    auVar18._4_4_ = fVar234 * fVar176;
    auVar18._0_4_ = fVar232 * fVar224;
    fVar247 = local_9c0._8_4_;
    auVar18._8_4_ = fVar247 * fVar152;
    fVar249 = local_9c0._12_4_;
    auVar18._12_4_ = fVar249 * fVar178;
    fVar251 = local_9c0._16_4_;
    auVar18._16_4_ = fVar251 * fVar201;
    fVar252 = local_9c0._20_4_;
    auVar18._20_4_ = fVar252 * fVar205;
    fVar253 = local_9c0._24_4_;
    auVar18._24_4_ = fVar253 * fVar227;
    auVar18._28_4_ = auVar283._28_4_;
    fVar254 = local_a80._0_4_;
    fVar280 = local_a80._4_4_;
    auVar19._4_4_ = fVar280 * fVar233;
    auVar19._0_4_ = fVar254 * fVar172;
    fVar120 = local_a80._8_4_;
    auVar19._8_4_ = fVar120 * fVar173;
    fVar122 = local_a80._12_4_;
    auVar19._12_4_ = fVar122 * fVar179;
    fVar123 = local_a80._16_4_;
    auVar19._16_4_ = fVar123 * fVar202;
    fVar124 = local_a80._20_4_;
    auVar19._20_4_ = fVar124 * fVar206;
    fVar125 = local_a80._24_4_;
    auVar19._24_4_ = fVar125 * fVar229;
    auVar19._28_4_ = auVar289._28_4_;
    auVar169 = vsubps_avx(auVar19,auVar18);
    auVar283 = vperm2f128_avx(local_a60,local_a60,1);
    auVar283 = vshufps_avx(auVar283,local_a60,0x30);
    local_900 = vshufps_avx(local_a60,auVar283,0x29);
    fVar314 = local_900._0_4_;
    fVar319 = local_900._4_4_;
    auVar20._4_4_ = fVar319 * fVar233;
    auVar20._0_4_ = fVar314 * fVar172;
    fVar321 = local_900._8_4_;
    auVar20._8_4_ = fVar321 * fVar173;
    fVar323 = local_900._12_4_;
    auVar20._12_4_ = fVar323 * fVar179;
    fVar325 = local_900._16_4_;
    auVar20._16_4_ = fVar325 * fVar202;
    fVar327 = local_900._20_4_;
    auVar20._20_4_ = fVar327 * fVar206;
    fVar329 = local_900._24_4_;
    auVar20._24_4_ = fVar329 * fVar229;
    auVar20._28_4_ = auVar283._28_4_;
    auVar13 = local_9c0;
    auVar21._4_4_ = fVar234 * fVar246;
    auVar21._0_4_ = fVar232 * fVar226;
    auVar21._8_4_ = fVar247 * fVar175;
    auVar21._12_4_ = fVar249 * fVar180;
    auVar21._16_4_ = fVar251 * fVar203;
    auVar21._20_4_ = fVar252 * fVar209;
    auVar21._24_4_ = fVar253 * fVar230;
    auVar21._28_4_ = auVar302._28_4_;
    auVar11 = vsubps_avx(auVar21,auVar20);
    auVar22._4_4_ = fVar280 * fVar246;
    auVar22._0_4_ = fVar254 * fVar226;
    auVar22._8_4_ = fVar120 * fVar175;
    auVar22._12_4_ = fVar122 * fVar180;
    auVar22._16_4_ = fVar123 * fVar203;
    auVar22._20_4_ = fVar124 * fVar209;
    auVar22._24_4_ = fVar125 * fVar230;
    auVar22._28_4_ = auVar302._28_4_;
    auVar23._4_4_ = fVar319 * fVar176;
    auVar23._0_4_ = fVar314 * fVar224;
    auVar23._8_4_ = fVar321 * fVar152;
    auVar23._12_4_ = fVar323 * fVar178;
    auVar23._16_4_ = fVar325 * fVar201;
    auVar23._20_4_ = fVar327 * fVar205;
    fVar208 = local_900._28_4_;
    auVar23._24_4_ = fVar329 * fVar227;
    auVar23._28_4_ = fVar208;
    auVar12 = vsubps_avx(auVar23,auVar22);
    auVar24._4_4_ =
         (auVar333._4_4_ * auVar333._4_4_ +
         auVar136._4_4_ * auVar136._4_4_ + auVar286._4_4_ * auVar286._4_4_) * fVar177;
    auVar24._0_4_ =
         (auVar333._0_4_ * auVar333._0_4_ +
         auVar136._0_4_ * auVar136._0_4_ + auVar286._0_4_ * auVar286._0_4_) * fVar248;
    auVar24._8_4_ =
         (auVar333._8_4_ * auVar333._8_4_ +
         auVar136._8_4_ * auVar136._8_4_ + auVar286._8_4_ * auVar286._8_4_) * fVar182;
    auVar24._12_4_ =
         (auVar333._12_4_ * auVar333._12_4_ +
         auVar136._12_4_ * auVar136._12_4_ + auVar286._12_4_ * auVar286._12_4_) * fVar204;
    auVar24._16_4_ =
         (auVar333._16_4_ * auVar333._16_4_ +
         auVar136._16_4_ * auVar136._16_4_ + auVar286._16_4_ * auVar286._16_4_) * fVar225;
    auVar24._20_4_ =
         (auVar333._20_4_ * auVar333._20_4_ +
         auVar136._20_4_ * auVar136._20_4_ + auVar286._20_4_ * auVar286._20_4_) * fVar231;
    auVar24._24_4_ =
         (auVar333._24_4_ * auVar333._24_4_ +
         auVar136._24_4_ * auVar136._24_4_ + auVar286._24_4_ * auVar286._24_4_) * fVar207;
    auVar24._28_4_ = auVar333._28_4_ + fVar174;
    auVar25._4_4_ =
         (auVar169._4_4_ * auVar169._4_4_ +
         auVar11._4_4_ * auVar11._4_4_ + auVar12._4_4_ * auVar12._4_4_) * fVar177;
    auVar25._0_4_ =
         (auVar169._0_4_ * auVar169._0_4_ +
         auVar11._0_4_ * auVar11._0_4_ + auVar12._0_4_ * auVar12._0_4_) * fVar248;
    auVar25._8_4_ =
         (auVar169._8_4_ * auVar169._8_4_ +
         auVar11._8_4_ * auVar11._8_4_ + auVar12._8_4_ * auVar12._8_4_) * fVar182;
    auVar25._12_4_ =
         (auVar169._12_4_ * auVar169._12_4_ +
         auVar11._12_4_ * auVar11._12_4_ + auVar12._12_4_ * auVar12._12_4_) * fVar204;
    auVar25._16_4_ =
         (auVar169._16_4_ * auVar169._16_4_ +
         auVar11._16_4_ * auVar11._16_4_ + auVar12._16_4_ * auVar12._16_4_) * fVar225;
    auVar25._20_4_ =
         (auVar169._20_4_ * auVar169._20_4_ +
         auVar11._20_4_ * auVar11._20_4_ + auVar12._20_4_ * auVar12._20_4_) * fVar231;
    auVar25._24_4_ =
         (auVar169._24_4_ * auVar169._24_4_ +
         auVar11._24_4_ * auVar11._24_4_ + auVar12._24_4_ * auVar12._24_4_) * fVar207;
    auVar25._28_4_ = auVar260._28_4_ + auVar107._28_4_;
    auVar107 = vmaxps_avx(auVar24,auVar25);
    auVar283 = vperm2f128_avx(local_700,local_700,1);
    auVar283 = vshufps_avx(auVar283,local_700,0x30);
    local_720 = vshufps_avx(local_700,auVar283,0x29);
    local_740._0_4_ = (float)local_700._0_4_ + auVar85._0_4_;
    local_740._4_4_ = local_700._4_4_ + auVar85._4_4_;
    fStack_738 = local_700._8_4_ + auVar85._8_4_;
    fStack_734 = local_700._12_4_ + auVar85._12_4_;
    fStack_730 = local_700._16_4_ + auVar85._16_4_;
    fStack_72c = local_700._20_4_ + auVar85._20_4_;
    fStack_728 = local_700._24_4_ + auVar85._24_4_;
    fStack_724 = local_700._28_4_ + 0.0;
    auVar283 = vmaxps_avx(local_700,_local_740);
    auVar333 = vmaxps_avx(auVar344,local_720);
    auVar283 = vmaxps_avx(auVar283,auVar333);
    auVar333 = vrsqrtps_avx(auVar168);
    fVar174 = auVar333._0_4_;
    fVar248 = auVar333._4_4_;
    fVar177 = auVar333._8_4_;
    fVar182 = auVar333._12_4_;
    fVar204 = auVar333._16_4_;
    fVar225 = auVar333._20_4_;
    fVar231 = auVar333._24_4_;
    local_420 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar168._0_4_ * -0.5;
    fStack_41c = fVar248 * 1.5 + fVar248 * fVar248 * fVar248 * auVar168._4_4_ * -0.5;
    fStack_418 = fVar177 * 1.5 + fVar177 * fVar177 * fVar177 * auVar168._8_4_ * -0.5;
    fStack_414 = fVar182 * 1.5 + fVar182 * fVar182 * fVar182 * auVar168._12_4_ * -0.5;
    fStack_410 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar168._16_4_ * -0.5;
    fStack_40c = fVar225 * 1.5 + fVar225 * fVar225 * fVar225 * auVar168._20_4_ * -0.5;
    fStack_408 = fVar231 * 1.5 + fVar231 * fVar231 * fVar231 * auVar168._24_4_ * -0.5;
    fStack_404 = auVar333._28_4_ + auVar168._28_4_;
    _local_aa0 = vsubps_avx(ZEXT832(0) << 0x20,local_600);
    local_9e0 = vsubps_avx(ZEXT832(0) << 0x20,local_5e0);
    fVar331 = local_9e0._0_4_;
    fVar337 = local_9e0._4_4_;
    fVar338 = local_9e0._8_4_;
    fVar339 = local_9e0._12_4_;
    fVar340 = local_9e0._16_4_;
    fVar341 = local_9e0._20_4_;
    fVar342 = local_9e0._24_4_;
    fVar272 = local_aa0._0_4_;
    fVar274 = local_aa0._4_4_;
    fVar275 = local_aa0._8_4_;
    fVar276 = local_aa0._12_4_;
    fVar277 = local_aa0._16_4_;
    fVar278 = local_aa0._20_4_;
    fVar279 = local_aa0._24_4_;
    auVar136 = vsubps_avx(ZEXT832(0) << 0x20,auVar348);
    fVar174 = auVar136._0_4_;
    fVar248 = auVar136._4_4_;
    fVar177 = auVar136._8_4_;
    fVar182 = auVar136._12_4_;
    fVar204 = auVar136._16_4_;
    fVar225 = auVar136._20_4_;
    fVar231 = auVar136._24_4_;
    auVar290._0_4_ = local_4c0 * fVar174 + fVar272 * local_760 + fVar331 * local_780;
    auVar290._4_4_ = fStack_4bc * fVar248 + fVar274 * fStack_75c + fVar337 * fStack_77c;
    auVar290._8_4_ = fStack_4b8 * fVar177 + fVar275 * fStack_758 + fVar338 * fStack_778;
    auVar290._12_4_ = fStack_4b4 * fVar182 + fVar276 * fStack_754 + fVar339 * fStack_774;
    auVar290._16_4_ = fStack_4b0 * fVar204 + fVar277 * fStack_750 + fVar340 * fStack_770;
    auVar290._20_4_ = fStack_4ac * fVar225 + fVar278 * fStack_74c + fVar341 * fStack_76c;
    auVar290._24_4_ = fStack_4a8 * fVar231 + fVar279 * fStack_748 + fVar342 * fStack_768;
    auVar290._28_4_ = auVar11._28_4_ + auVar12._28_4_ + auVar333._28_4_ + 0.0;
    auVar303._0_4_ = fVar174 * fVar174 + fVar272 * fVar272 + fVar331 * fVar331;
    auVar303._4_4_ = fVar248 * fVar248 + fVar274 * fVar274 + fVar337 * fVar337;
    auVar303._8_4_ = fVar177 * fVar177 + fVar275 * fVar275 + fVar338 * fVar338;
    auVar303._12_4_ = fVar182 * fVar182 + fVar276 * fVar276 + fVar339 * fVar339;
    auVar303._16_4_ = fVar204 * fVar204 + fVar277 * fVar277 + fVar340 * fVar340;
    auVar303._20_4_ = fVar225 * fVar225 + fVar278 * fVar278 + fVar341 * fVar341;
    auVar303._24_4_ = fVar231 * fVar231 + fVar279 * fVar279 + fVar342 * fVar342;
    auVar303._28_4_ = fVar208 + fVar208 + 0.0;
    fVar208 = local_2e0._28_4_;
    fVar207 = fVar208 + local_620._28_4_;
    local_520 = local_4c0 * local_420 * fVar226 +
                local_420 * fVar224 * local_760 + local_420 * fVar172 * local_780;
    fStack_51c = fStack_4bc * fStack_41c * fVar246 +
                 fStack_41c * fVar176 * fStack_75c + fStack_41c * fVar233 * fStack_77c;
    fStack_518 = fStack_4b8 * fStack_418 * fVar175 +
                 fStack_418 * fVar152 * fStack_758 + fStack_418 * fVar173 * fStack_778;
    fStack_514 = fStack_4b4 * fStack_414 * fVar180 +
                 fStack_414 * fVar178 * fStack_754 + fStack_414 * fVar179 * fStack_774;
    fStack_510 = fStack_4b0 * fStack_410 * fVar203 +
                 fStack_410 * fVar201 * fStack_750 + fStack_410 * fVar202 * fStack_770;
    fStack_50c = fStack_4ac * fStack_40c * fVar209 +
                 fStack_40c * fVar205 * fStack_74c + fStack_40c * fVar206 * fStack_76c;
    fStack_508 = fStack_4a8 * fStack_408 * fVar230 +
                 fStack_408 * fVar227 * fStack_748 + fStack_408 * fVar229 * fStack_768;
    fStack_504 = local_300._28_4_ + fVar207;
    fVar207 = local_300._28_4_ + fVar207;
    local_6c0._0_4_ =
         fVar174 * local_420 * fVar226 +
         fVar272 * local_420 * fVar224 + fVar331 * local_420 * fVar172;
    local_6c0._4_4_ =
         fVar248 * fStack_41c * fVar246 +
         fVar274 * fStack_41c * fVar176 + fVar337 * fStack_41c * fVar233;
    fStack_6b8 = fVar177 * fStack_418 * fVar175 +
                 fVar275 * fStack_418 * fVar152 + fVar338 * fStack_418 * fVar173;
    fStack_6b4 = fVar182 * fStack_414 * fVar180 +
                 fVar276 * fStack_414 * fVar178 + fVar339 * fStack_414 * fVar179;
    fStack_6b0 = fVar204 * fStack_410 * fVar203 +
                 fVar277 * fStack_410 * fVar201 + fVar340 * fStack_410 * fVar202;
    fStack_6ac = fVar225 * fStack_40c * fVar209 +
                 fVar278 * fStack_40c * fVar205 + fVar341 * fStack_40c * fVar206;
    fStack_6a8 = fVar231 * fStack_408 * fVar230 +
                 fVar279 * fStack_408 * fVar227 + fVar342 * fStack_408 * fVar229;
    fStack_6a4 = fVar208 + fVar207;
    auVar26._4_4_ = (float)local_6c0._4_4_ * fStack_51c;
    auVar26._0_4_ = (float)local_6c0._0_4_ * local_520;
    auVar26._8_4_ = fStack_6b8 * fStack_518;
    auVar26._12_4_ = fStack_6b4 * fStack_514;
    auVar26._16_4_ = fStack_6b0 * fStack_510;
    auVar26._20_4_ = fStack_6ac * fStack_50c;
    auVar26._24_4_ = fStack_6a8 * fStack_508;
    auVar26._28_4_ = fVar207;
    auVar333 = vsubps_avx(auVar290,auVar26);
    auVar27._4_4_ = (float)local_6c0._4_4_ * (float)local_6c0._4_4_;
    auVar27._0_4_ = (float)local_6c0._0_4_ * (float)local_6c0._0_4_;
    auVar27._8_4_ = fStack_6b8 * fStack_6b8;
    auVar27._12_4_ = fStack_6b4 * fStack_6b4;
    auVar27._16_4_ = fStack_6b0 * fStack_6b0;
    auVar27._20_4_ = fStack_6ac * fStack_6ac;
    auVar27._24_4_ = fStack_6a8 * fStack_6a8;
    auVar27._28_4_ = fVar208;
    local_3c0 = vsubps_avx(auVar303,auVar27);
    local_840 = vsqrtps_avx(auVar107);
    fVar208 = (auVar283._0_4_ + local_840._0_4_) * 1.0000002;
    fVar207 = (auVar283._4_4_ + local_840._4_4_) * 1.0000002;
    fVar145 = (auVar283._8_4_ + local_840._8_4_) * 1.0000002;
    fVar146 = (auVar283._12_4_ + local_840._12_4_) * 1.0000002;
    fVar147 = (auVar283._16_4_ + local_840._16_4_) * 1.0000002;
    fVar148 = (auVar283._20_4_ + local_840._20_4_) * 1.0000002;
    fVar150 = (auVar283._24_4_ + local_840._24_4_) * 1.0000002;
    auVar28._4_4_ = fVar207 * fVar207;
    auVar28._0_4_ = fVar208 * fVar208;
    auVar28._8_4_ = fVar145 * fVar145;
    auVar28._12_4_ = fVar146 * fVar146;
    auVar28._16_4_ = fVar147 * fVar147;
    auVar28._20_4_ = fVar148 * fVar148;
    auVar28._24_4_ = fVar150 * fVar150;
    auVar28._28_4_ = auVar283._28_4_ + local_840._28_4_;
    local_460._0_4_ = auVar333._0_4_ + auVar333._0_4_;
    local_460._4_4_ = auVar333._4_4_ + auVar333._4_4_;
    local_460._8_4_ = auVar333._8_4_ + auVar333._8_4_;
    local_460._12_4_ = auVar333._12_4_ + auVar333._12_4_;
    local_460._16_4_ = auVar333._16_4_ + auVar333._16_4_;
    local_460._20_4_ = auVar333._20_4_ + auVar333._20_4_;
    local_460._24_4_ = auVar333._24_4_ + auVar333._24_4_;
    fVar208 = auVar333._28_4_;
    local_460._28_4_ = fVar208 + fVar208;
    auVar283 = vsubps_avx(local_3c0,auVar28);
    auVar29._4_4_ = fStack_51c * fStack_51c;
    auVar29._0_4_ = local_520 * local_520;
    auVar29._8_4_ = fStack_518 * fStack_518;
    auVar29._12_4_ = fStack_514 * fStack_514;
    auVar29._16_4_ = fStack_510 * fStack_510;
    auVar29._20_4_ = fStack_50c * fStack_50c;
    auVar29._24_4_ = fStack_508 * fStack_508;
    auVar29._28_4_ = fVar208;
    auVar333 = vsubps_avx(local_1e0,auVar29);
    local_680._4_4_ = local_460._4_4_ * local_460._4_4_;
    local_680._0_4_ = local_460._0_4_ * local_460._0_4_;
    local_680._8_4_ = local_460._8_4_ * local_460._8_4_;
    local_680._12_4_ = local_460._12_4_ * local_460._12_4_;
    local_680._16_4_ = local_460._16_4_ * local_460._16_4_;
    local_680._20_4_ = local_460._20_4_ * local_460._20_4_;
    local_680._24_4_ = local_460._24_4_ * local_460._24_4_;
    local_680._28_4_ = local_1e0._28_4_;
    fVar208 = auVar333._0_4_;
    local_7a0._0_4_ = fVar208 * 4.0;
    fVar207 = auVar333._4_4_;
    local_7a0._4_4_ = fVar207 * 4.0;
    fVar145 = auVar333._8_4_;
    fStack_798 = fVar145 * 4.0;
    fVar146 = auVar333._12_4_;
    fStack_794 = fVar146 * 4.0;
    fVar147 = auVar333._16_4_;
    fStack_790 = fVar147 * 4.0;
    fVar148 = auVar333._20_4_;
    fStack_78c = fVar148 * 4.0;
    fVar150 = auVar333._24_4_;
    fStack_788 = fVar150 * 4.0;
    fStack_784 = 4.0;
    auVar30._4_4_ = auVar283._4_4_ * (float)local_7a0._4_4_;
    auVar30._0_4_ = auVar283._0_4_ * (float)local_7a0._0_4_;
    auVar30._8_4_ = auVar283._8_4_ * fStack_798;
    auVar30._12_4_ = auVar283._12_4_ * fStack_794;
    auVar30._16_4_ = auVar283._16_4_ * fStack_790;
    auVar30._20_4_ = auVar283._20_4_ * fStack_78c;
    auVar30._24_4_ = auVar283._24_4_ * fStack_788;
    auVar30._28_4_ = 0x40800000;
    auVar286 = vsubps_avx(local_680,auVar30);
    auVar107 = vcmpps_avx(auVar286,ZEXT832(0) << 0x20,5);
    auVar262._8_4_ = 0x7fffffff;
    auVar262._0_8_ = 0x7fffffff7fffffff;
    auVar262._12_4_ = 0x7fffffff;
    auVar262._16_4_ = 0x7fffffff;
    auVar262._20_4_ = 0x7fffffff;
    auVar262._24_4_ = 0x7fffffff;
    auVar262._28_4_ = 0x7fffffff;
    local_440 = vandps_avx(auVar29,auVar262);
    local_320._0_4_ = fVar208 + fVar208;
    local_320._4_4_ = fVar207 + fVar207;
    local_320._8_4_ = fVar145 + fVar145;
    local_320._12_4_ = fVar146 + fVar146;
    local_320._16_4_ = fVar147 + fVar147;
    local_320._20_4_ = fVar148 + fVar148;
    local_320._24_4_ = fVar150 + fVar150;
    local_320._28_4_ = auVar333._28_4_ + auVar333._28_4_;
    local_940 = vandps_avx(auVar333,auVar262);
    uVar59 = CONCAT44(local_460._4_4_,local_460._0_4_);
    local_480._0_8_ = uVar59 ^ 0x8000000080000000;
    local_480._8_4_ = -local_460._8_4_;
    local_480._12_4_ = -local_460._12_4_;
    local_480._16_4_ = -local_460._16_4_;
    local_480._20_4_ = -local_460._20_4_;
    local_480._24_4_ = -local_460._24_4_;
    local_480._28_4_ = -local_460._28_4_;
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0x7f,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar107 >> 0xbf,0) == '\0') &&
        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar107[0x1f])
    {
      auVar285._8_4_ = 0x7f800000;
      auVar285._0_8_ = 0x7f8000007f800000;
      auVar285._12_4_ = 0x7f800000;
      auVar285._16_4_ = 0x7f800000;
      auVar285._20_4_ = 0x7f800000;
      auVar285._24_4_ = 0x7f800000;
      auVar285._28_4_ = 0x7f800000;
      auVar345._8_4_ = 0xff800000;
      auVar345._0_8_ = 0xff800000ff800000;
      auVar345._12_4_ = 0xff800000;
      auVar345._16_4_ = 0xff800000;
      auVar345._20_4_ = 0xff800000;
      auVar345._24_4_ = 0xff800000;
      auVar345._28_4_ = 0xff800000;
    }
    else {
      auVar169 = vsqrtps_avx(auVar286);
      auVar260 = vrcpps_avx(local_320);
      auVar333 = vcmpps_avx(auVar286,ZEXT832(0) << 0x20,5);
      fVar208 = auVar260._0_4_;
      fVar207 = auVar260._4_4_;
      auVar31._4_4_ = local_320._4_4_ * fVar207;
      auVar31._0_4_ = local_320._0_4_ * fVar208;
      fVar145 = auVar260._8_4_;
      auVar31._8_4_ = local_320._8_4_ * fVar145;
      fVar146 = auVar260._12_4_;
      auVar31._12_4_ = local_320._12_4_ * fVar146;
      fVar147 = auVar260._16_4_;
      auVar31._16_4_ = local_320._16_4_ * fVar147;
      fVar148 = auVar260._20_4_;
      auVar31._20_4_ = local_320._20_4_ * fVar148;
      fVar150 = auVar260._24_4_;
      auVar31._24_4_ = local_320._24_4_ * fVar150;
      auVar31._28_4_ = local_320._28_4_;
      auVar87._8_4_ = 0x3f800000;
      auVar87._0_8_ = 0x3f8000003f800000;
      auVar87._12_4_ = 0x3f800000;
      auVar87._16_4_ = 0x3f800000;
      auVar87._20_4_ = 0x3f800000;
      auVar87._24_4_ = 0x3f800000;
      auVar87._28_4_ = 0x3f800000;
      auVar286 = vsubps_avx(auVar87,auVar31);
      fVar208 = fVar208 + fVar208 * auVar286._0_4_;
      fVar207 = fVar207 + fVar207 * auVar286._4_4_;
      fVar145 = fVar145 + fVar145 * auVar286._8_4_;
      fVar146 = fVar146 + fVar146 * auVar286._12_4_;
      fVar147 = fVar147 + fVar147 * auVar286._16_4_;
      fVar148 = fVar148 + fVar148 * auVar286._20_4_;
      fVar150 = fVar150 + fVar150 * auVar286._24_4_;
      auVar286 = vsubps_avx(local_480,auVar169);
      fVar181 = auVar286._0_4_ * fVar208;
      fVar266 = auVar286._4_4_ * fVar207;
      auVar32._4_4_ = fVar266;
      auVar32._0_4_ = fVar181;
      fVar267 = auVar286._8_4_ * fVar145;
      auVar32._8_4_ = fVar267;
      fVar268 = auVar286._12_4_ * fVar146;
      auVar32._12_4_ = fVar268;
      fVar269 = auVar286._16_4_ * fVar147;
      auVar32._16_4_ = fVar269;
      fVar270 = auVar286._20_4_ * fVar148;
      auVar32._20_4_ = fVar270;
      fVar271 = auVar286._24_4_ * fVar150;
      auVar32._24_4_ = fVar271;
      auVar32._28_4_ = auVar286._28_4_;
      auVar286 = vsubps_avx(auVar169,local_460);
      fVar208 = auVar286._0_4_ * fVar208;
      fVar207 = auVar286._4_4_ * fVar207;
      auVar33._4_4_ = fVar207;
      auVar33._0_4_ = fVar208;
      fVar145 = auVar286._8_4_ * fVar145;
      auVar33._8_4_ = fVar145;
      fVar146 = auVar286._12_4_ * fVar146;
      auVar33._12_4_ = fVar146;
      fVar147 = auVar286._16_4_ * fVar147;
      auVar33._16_4_ = fVar147;
      fVar148 = auVar286._20_4_ * fVar148;
      auVar33._20_4_ = fVar148;
      fVar150 = auVar286._24_4_ * fVar150;
      auVar33._24_4_ = fVar150;
      auVar33._28_4_ = auVar286._28_4_;
      local_400 = local_420 * ((float)local_6c0._0_4_ + local_520 * fVar181);
      fStack_3fc = fStack_41c * ((float)local_6c0._4_4_ + fStack_51c * fVar266);
      fStack_3f8 = fStack_418 * (fStack_6b8 + fStack_518 * fVar267);
      fStack_3f4 = fStack_414 * (fStack_6b4 + fStack_514 * fVar268);
      fStack_3f0 = fStack_410 * (fStack_6b0 + fStack_510 * fVar269);
      fStack_3ec = fStack_40c * (fStack_6ac + fStack_50c * fVar270);
      fStack_3e8 = fStack_408 * (fStack_6a8 + fStack_508 * fVar271);
      uStack_3e4 = 0x3f800000;
      local_3e0 = local_420 * ((float)local_6c0._0_4_ + local_520 * fVar208);
      fStack_3dc = fStack_41c * ((float)local_6c0._4_4_ + fStack_51c * fVar207);
      fStack_3d8 = fStack_418 * (fStack_6b8 + fStack_518 * fVar145);
      fStack_3d4 = fStack_414 * (fStack_6b4 + fStack_514 * fVar146);
      fStack_3d0 = fStack_410 * (fStack_6b0 + fStack_510 * fVar147);
      fStack_3cc = fStack_40c * (fStack_6ac + fStack_50c * fVar148);
      fStack_3c8 = fStack_408 * (fStack_6a8 + fStack_508 * fVar150);
      uStack_3c4 = 0x3f800000;
      auVar242._8_4_ = 0x7f800000;
      auVar242._0_8_ = 0x7f8000007f800000;
      auVar242._12_4_ = 0x7f800000;
      auVar242._16_4_ = 0x7f800000;
      auVar242._20_4_ = 0x7f800000;
      auVar242._24_4_ = 0x7f800000;
      auVar242._28_4_ = 0x7f800000;
      auVar285 = vblendvps_avx(auVar242,auVar32,auVar333);
      auVar243._8_4_ = 0xff800000;
      auVar243._0_8_ = 0xff800000ff800000;
      auVar243._12_4_ = 0xff800000;
      auVar243._16_4_ = 0xff800000;
      auVar243._20_4_ = 0xff800000;
      auVar243._24_4_ = 0xff800000;
      auVar243._28_4_ = 0xff800000;
      auVar345 = vblendvps_avx(auVar243,auVar33,auVar333);
      auVar286 = vmaxps_avx(local_500,local_440);
      auVar34._4_4_ = auVar286._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar286._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar286._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar286._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar286._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar286._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar286._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar286._28_4_;
      auVar286 = vcmpps_avx(local_940,auVar34,1);
      auVar260 = auVar333 & auVar286;
      if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar260 >> 0x7f,0) != '\0') ||
            (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar260 >> 0xbf,0) != '\0') ||
          (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar260[0x1f] < '\0') {
        auVar107 = vandps_avx(auVar286,auVar333);
        auVar84 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar286 = vcmpps_avx(auVar283,_DAT_01f7b000,2);
        auVar293._8_4_ = 0xff800000;
        auVar293._0_8_ = 0xff800000ff800000;
        auVar293._12_4_ = 0xff800000;
        auVar293._16_4_ = 0xff800000;
        auVar293._20_4_ = 0xff800000;
        auVar293._24_4_ = 0xff800000;
        auVar293._28_4_ = 0xff800000;
        auVar305._8_4_ = 0x7f800000;
        auVar305._0_8_ = 0x7f8000007f800000;
        auVar305._12_4_ = 0x7f800000;
        auVar305._16_4_ = 0x7f800000;
        auVar305._20_4_ = 0x7f800000;
        auVar305._24_4_ = 0x7f800000;
        auVar305._28_4_ = 0x7f800000;
        auVar283 = vblendvps_avx(auVar305,auVar293,auVar286);
        auVar238 = vpmovsxwd_avx(auVar84);
        auVar84 = vpunpckhwd_avx(auVar84,auVar84);
        auVar223._16_16_ = auVar84;
        auVar223._0_16_ = auVar238;
        auVar285 = vblendvps_avx(auVar285,auVar283,auVar223);
        auVar265._8_4_ = 0xff800000;
        auVar265._0_8_ = 0xff800000ff800000;
        auVar265._12_4_ = 0xff800000;
        auVar265._16_4_ = 0xff800000;
        auVar265._20_4_ = 0xff800000;
        auVar265._24_4_ = 0xff800000;
        auVar265._28_4_ = 0xff800000;
        auVar283 = vblendvps_avx(auVar265,auVar305,auVar286);
        auVar345 = vblendvps_avx(auVar345,auVar283,auVar223);
        auVar144._0_8_ = auVar107._0_8_ ^ 0xffffffffffffffff;
        auVar144._8_4_ = auVar107._8_4_ ^ 0xffffffff;
        auVar144._12_4_ = auVar107._12_4_ ^ 0xffffffff;
        auVar144._16_4_ = auVar107._16_4_ ^ 0xffffffff;
        auVar144._20_4_ = auVar107._20_4_ ^ 0xffffffff;
        auVar144._24_4_ = auVar107._24_4_ ^ 0xffffffff;
        auVar144._28_4_ = auVar107._28_4_ ^ 0xffffffff;
        auVar107 = vorps_avx(auVar286,auVar144);
        auVar107 = vandps_avx(auVar333,auVar107);
      }
    }
    auVar245 = ZEXT3264(local_940);
    auVar283 = local_340 & auVar107;
    if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar283 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar283 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar283 >> 0x7f,0) == '\0') &&
          (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar283 >> 0xbf,0) == '\0') &&
        (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar283[0x1f])
    {
LAB_007d6699:
      auVar317 = ZEXT3264(local_8c0);
      local_840._0_8_ = uVar65;
      auVar260 = local_880;
      auVar136 = local_8a0;
      auVar286 = local_8e0;
    }
    else {
      auVar84 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7e0._0_4_));
      auVar84 = vshufps_avx(auVar84,auVar84,0);
      auVar218._16_16_ = auVar84;
      auVar218._0_16_ = auVar84;
      auVar286 = vmaxps_avx(auVar218,auVar285);
      auVar84 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7e0._0_4_));
      auVar84 = vshufps_avx(auVar84,auVar84,0);
      auVar219._16_16_ = auVar84;
      auVar219._0_16_ = auVar84;
      auVar260 = vminps_avx(auVar219,auVar345);
      fVar181 = local_460._28_4_ + fStack_504;
      auVar88._0_4_ = local_4c0 * fVar301 + local_760 * fVar288 + local_780 * fVar313;
      auVar88._4_4_ = fStack_4bc * fVar307 + fStack_75c * fVar295 + fStack_77c * fVar318;
      auVar88._8_4_ = fStack_4b8 * fVar308 + fStack_758 * fVar296 + fStack_778 * fVar320;
      auVar88._12_4_ = fStack_4b4 * fVar309 + fStack_754 * fVar297 + fStack_774 * fVar322;
      auVar88._16_4_ = fStack_4b0 * fVar310 + fStack_750 * fVar298 + fStack_770 * fVar324;
      auVar88._20_4_ = fStack_4ac * fVar311 + fStack_74c * fVar299 + fStack_76c * fVar326;
      auVar88._24_4_ = fStack_4a8 * fVar312 + fStack_748 * fVar300 + fStack_768 * fVar328;
      auVar88._28_4_ = fVar181 + fVar181 + fVar330;
      auVar283 = vrcpps_avx(auVar88);
      fVar208 = auVar283._0_4_;
      fVar207 = auVar283._4_4_;
      auVar35._4_4_ = auVar88._4_4_ * fVar207;
      auVar35._0_4_ = auVar88._0_4_ * fVar208;
      fVar145 = auVar283._8_4_;
      auVar35._8_4_ = auVar88._8_4_ * fVar145;
      fVar146 = auVar283._12_4_;
      auVar35._12_4_ = auVar88._12_4_ * fVar146;
      fVar147 = auVar283._16_4_;
      auVar35._16_4_ = auVar88._16_4_ * fVar147;
      fVar148 = auVar283._20_4_;
      auVar35._20_4_ = auVar88._20_4_ * fVar148;
      fVar150 = auVar283._24_4_;
      auVar35._24_4_ = auVar88._24_4_ * fVar150;
      auVar35._28_4_ = auVar302._28_4_;
      auVar334._8_4_ = 0x3f800000;
      auVar334._0_8_ = 0x3f8000003f800000;
      auVar334._12_4_ = 0x3f800000;
      auVar334._16_4_ = 0x3f800000;
      auVar334._20_4_ = 0x3f800000;
      auVar334._24_4_ = 0x3f800000;
      auVar334._28_4_ = 0x3f800000;
      auVar333 = vsubps_avx(auVar334,auVar35);
      auVar273._8_4_ = 0x7fffffff;
      auVar273._0_8_ = 0x7fffffff7fffffff;
      auVar273._12_4_ = 0x7fffffff;
      auVar273._16_4_ = 0x7fffffff;
      auVar273._20_4_ = 0x7fffffff;
      auVar273._24_4_ = 0x7fffffff;
      auVar273._28_4_ = 0x7fffffff;
      auVar283 = vandps_avx(auVar273,auVar88);
      auVar349._8_4_ = 0x219392ef;
      auVar349._0_8_ = 0x219392ef219392ef;
      auVar349._12_4_ = 0x219392ef;
      auVar349._16_4_ = 0x219392ef;
      auVar349._20_4_ = 0x219392ef;
      auVar349._24_4_ = 0x219392ef;
      auVar349._28_4_ = 0x219392ef;
      auVar283 = vcmpps_avx(auVar283,auVar349,1);
      auVar36._4_4_ =
           (fVar207 + fVar207 * auVar333._4_4_) *
           -(fVar248 * fVar307 + fVar295 * fVar274 + fVar318 * fVar337);
      auVar36._0_4_ =
           (fVar208 + fVar208 * auVar333._0_4_) *
           -(fVar174 * fVar301 + fVar288 * fVar272 + fVar313 * fVar331);
      auVar36._8_4_ =
           (fVar145 + fVar145 * auVar333._8_4_) *
           -(fVar177 * fVar308 + fVar296 * fVar275 + fVar320 * fVar338);
      auVar36._12_4_ =
           (fVar146 + fVar146 * auVar333._12_4_) *
           -(fVar182 * fVar309 + fVar297 * fVar276 + fVar322 * fVar339);
      auVar36._16_4_ =
           (fVar147 + fVar147 * auVar333._16_4_) *
           -(fVar204 * fVar310 + fVar298 * fVar277 + fVar324 * fVar340);
      auVar36._20_4_ =
           (fVar148 + fVar148 * auVar333._20_4_) *
           -(fVar225 * fVar311 + fVar299 * fVar278 + fVar326 * fVar341);
      auVar36._24_4_ =
           (fVar150 + fVar150 * auVar333._24_4_) *
           -(fVar231 * fVar312 + fVar300 * fVar279 + fVar328 * fVar342);
      auVar36._28_4_ = -(auVar136._28_4_ + fVar181);
      auVar169 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar333 = vcmpps_avx(auVar88,auVar169,1);
      auVar136 = vorps_avx(auVar283,auVar333);
      auVar333 = vcmpps_avx(auVar88,auVar169,6);
      auVar333 = vorps_avx(auVar283,auVar333);
      auVar304._8_4_ = 0xff800000;
      auVar304._0_8_ = 0xff800000ff800000;
      auVar304._12_4_ = 0xff800000;
      auVar304._16_4_ = 0xff800000;
      auVar304._20_4_ = 0xff800000;
      auVar304._24_4_ = 0xff800000;
      auVar304._28_4_ = 0xff800000;
      auVar283 = vblendvps_avx(auVar36,auVar304,auVar136);
      auVar316._8_4_ = 0x7f800000;
      auVar316._0_8_ = 0x7f8000007f800000;
      auVar316._12_4_ = 0x7f800000;
      auVar316._16_4_ = 0x7f800000;
      auVar316._20_4_ = 0x7f800000;
      auVar316._24_4_ = 0x7f800000;
      auVar316._28_4_ = 0x7f800000;
      auVar333 = vblendvps_avx(auVar36,auVar316,auVar333);
      auVar136 = vmaxps_avx(auVar286,auVar283);
      auVar286 = vminps_avx(auVar260,auVar333);
      auVar260 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar283 = vsubps_avx(auVar260,local_a00);
      auVar333 = vsubps_avx(auVar260,_local_920);
      auVar37._4_4_ = auVar333._4_4_ * -fVar234;
      auVar37._0_4_ = auVar333._0_4_ * -fVar232;
      auVar37._8_4_ = auVar333._8_4_ * -fVar247;
      auVar37._12_4_ = auVar333._12_4_ * -fVar249;
      auVar37._16_4_ = auVar333._16_4_ * -fVar251;
      auVar37._20_4_ = auVar333._20_4_ * -fVar252;
      auVar37._24_4_ = auVar333._24_4_ * -fVar253;
      auVar37._28_4_ = auVar333._28_4_;
      auVar38._4_4_ = fVar280 * auVar283._4_4_;
      auVar38._0_4_ = fVar254 * auVar283._0_4_;
      auVar38._8_4_ = fVar120 * auVar283._8_4_;
      auVar38._12_4_ = fVar122 * auVar283._12_4_;
      auVar38._16_4_ = fVar123 * auVar283._16_4_;
      auVar38._20_4_ = fVar124 * auVar283._20_4_;
      auVar38._24_4_ = fVar125 * auVar283._24_4_;
      auVar38._28_4_ = auVar283._28_4_;
      auVar283 = vsubps_avx(auVar37,auVar38);
      auVar333 = vsubps_avx(auVar260,local_9a0);
      auVar335._8_4_ = 0x3f800000;
      auVar335._0_8_ = 0x3f8000003f800000;
      auVar335._12_4_ = 0x3f800000;
      auVar335._16_4_ = 0x3f800000;
      auVar335._20_4_ = 0x3f800000;
      auVar335._24_4_ = 0x3f800000;
      auVar335._28_4_ = 0x3f800000;
      auVar39._4_4_ = fVar319 * auVar333._4_4_;
      auVar39._0_4_ = fVar314 * auVar333._0_4_;
      auVar39._8_4_ = fVar321 * auVar333._8_4_;
      auVar39._12_4_ = fVar323 * auVar333._12_4_;
      auVar39._16_4_ = fVar325 * auVar333._16_4_;
      auVar39._20_4_ = fVar327 * auVar333._20_4_;
      uVar70 = auVar333._28_4_;
      auVar39._24_4_ = fVar329 * auVar333._24_4_;
      auVar39._28_4_ = uVar70;
      auVar260 = vsubps_avx(auVar283,auVar39);
      auVar40._4_4_ = fStack_77c * -fVar234;
      auVar40._0_4_ = local_780 * -fVar232;
      auVar40._8_4_ = fStack_778 * -fVar247;
      auVar40._12_4_ = fStack_774 * -fVar249;
      auVar40._16_4_ = fStack_770 * -fVar251;
      auVar40._20_4_ = fStack_76c * -fVar252;
      auVar40._24_4_ = fStack_768 * -fVar253;
      auVar40._28_4_ = local_9c0._28_4_ ^ 0x80000000;
      auVar41._4_4_ = fStack_75c * fVar280;
      auVar41._0_4_ = local_760 * fVar254;
      auVar41._8_4_ = fStack_758 * fVar120;
      auVar41._12_4_ = fStack_754 * fVar122;
      auVar41._16_4_ = fStack_750 * fVar123;
      auVar41._20_4_ = fStack_74c * fVar124;
      auVar41._24_4_ = fStack_748 * fVar125;
      auVar41._28_4_ = uVar70;
      auVar283 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar319 * fStack_4bc;
      auVar42._0_4_ = fVar314 * local_4c0;
      auVar42._8_4_ = fVar321 * fStack_4b8;
      auVar42._12_4_ = fVar323 * fStack_4b4;
      auVar42._16_4_ = fVar325 * fStack_4b0;
      auVar42._20_4_ = fVar327 * fStack_4ac;
      auVar42._24_4_ = fVar329 * fStack_4a8;
      auVar42._28_4_ = uVar70;
      auVar58 = ZEXT812(0);
      auVar282 = ZEXT1228(auVar58) << 0x20;
      auVar169 = vsubps_avx(auVar283,auVar42);
      auVar283 = vrcpps_avx(auVar169);
      fVar208 = auVar283._0_4_;
      fVar174 = auVar283._4_4_;
      auVar43._4_4_ = auVar169._4_4_ * fVar174;
      auVar43._0_4_ = auVar169._0_4_ * fVar208;
      fVar248 = auVar283._8_4_;
      auVar43._8_4_ = auVar169._8_4_ * fVar248;
      fVar177 = auVar283._12_4_;
      auVar43._12_4_ = auVar169._12_4_ * fVar177;
      fVar182 = auVar283._16_4_;
      auVar43._16_4_ = auVar169._16_4_ * fVar182;
      fVar204 = auVar283._20_4_;
      auVar43._20_4_ = auVar169._20_4_ * fVar204;
      fVar225 = auVar283._24_4_;
      auVar43._24_4_ = auVar169._24_4_ * fVar225;
      auVar43._28_4_ = local_a80._28_4_;
      auVar11 = vsubps_avx(auVar335,auVar43);
      auVar283 = vandps_avx(auVar273,auVar169);
      auVar109._8_4_ = 0x219392ef;
      auVar109._0_8_ = 0x219392ef219392ef;
      auVar109._12_4_ = 0x219392ef;
      auVar109._16_4_ = 0x219392ef;
      auVar109._20_4_ = 0x219392ef;
      auVar109._24_4_ = 0x219392ef;
      auVar109._28_4_ = 0x219392ef;
      auVar333 = vcmpps_avx(auVar283,auVar109,1);
      auVar245 = ZEXT3264(auVar333);
      auVar44._4_4_ = (fVar174 + fVar174 * auVar11._4_4_) * -auVar260._4_4_;
      auVar44._0_4_ = (fVar208 + fVar208 * auVar11._0_4_) * -auVar260._0_4_;
      auVar44._8_4_ = (fVar248 + fVar248 * auVar11._8_4_) * -auVar260._8_4_;
      auVar44._12_4_ = (fVar177 + fVar177 * auVar11._12_4_) * -auVar260._12_4_;
      auVar44._16_4_ = (fVar182 + fVar182 * auVar11._16_4_) * -auVar260._16_4_;
      auVar44._20_4_ = (fVar204 + fVar204 * auVar11._20_4_) * -auVar260._20_4_;
      auVar44._24_4_ = (fVar225 + fVar225 * auVar11._24_4_) * -auVar260._24_4_;
      auVar44._28_4_ = auVar260._28_4_ ^ 0x80000000;
      auVar283 = vcmpps_avx(auVar169,ZEXT1232(auVar58) << 0x20,1);
      auVar283 = vorps_avx(auVar333,auVar283);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar283 = vblendvps_avx(auVar44,auVar110,auVar283);
      local_6a0 = vmaxps_avx(auVar136,auVar283);
      auVar283 = vcmpps_avx(auVar169,ZEXT1232(auVar58) << 0x20,6);
      auVar283 = vorps_avx(auVar333,auVar283);
      auVar283 = vblendvps_avx(auVar44,auVar316,auVar283);
      auVar107 = vandps_avx(auVar107,local_340);
      local_580 = vminps_avx(auVar286,auVar283);
      auVar283 = vcmpps_avx(local_6a0,local_580,2);
      auVar333 = auVar107 & auVar283;
      if ((((((((auVar333 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar333 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar333 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar333 >> 0x7f,0) == '\0') &&
            (auVar333 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar333 >> 0xbf,0) == '\0') &&
          (auVar333 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar333[0x1f]) goto LAB_007d6699;
      auVar333 = vminps_avx(local_700,_local_740);
      auVar344 = vminps_avx(auVar344,local_720);
      auVar333 = vminps_avx(auVar333,auVar344);
      auVar333 = vsubps_avx(auVar333,local_840);
      auVar107 = vandps_avx(auVar283,auVar107);
      auVar60._4_4_ = fStack_3fc;
      auVar60._0_4_ = local_400;
      auVar60._8_4_ = fStack_3f8;
      auVar60._12_4_ = fStack_3f4;
      auVar60._16_4_ = fStack_3f0;
      auVar60._20_4_ = fStack_3ec;
      auVar60._24_4_ = fStack_3e8;
      auVar60._28_4_ = uStack_3e4;
      auVar283 = vminps_avx(auVar60,auVar335);
      auVar136 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar283 = vmaxps_avx(auVar283,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar149 + fVar151 * (auVar283._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar343 + fVar228 * (auVar283._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar346 + fVar250 * (auVar283._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar347 + fVar126 * (auVar283._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar149 + fVar151 * (auVar283._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar343 + fVar228 * (auVar283._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar346 + fVar250 * (auVar283._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar347 + auVar283._28_4_ + 7.0;
      auVar61._4_4_ = fStack_3dc;
      auVar61._0_4_ = local_3e0;
      auVar61._8_4_ = fStack_3d8;
      auVar61._12_4_ = fStack_3d4;
      auVar61._16_4_ = fStack_3d0;
      auVar61._20_4_ = fStack_3cc;
      auVar61._24_4_ = fStack_3c8;
      auVar61._28_4_ = uStack_3c4;
      auVar283 = vminps_avx(auVar61,auVar335);
      auVar283 = vmaxps_avx(auVar283,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar149 + fVar151 * (auVar283._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar343 + fVar228 * (auVar283._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar346 + fVar250 * (auVar283._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar347 + fVar126 * (auVar283._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar149 + fVar151 * (auVar283._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar343 + fVar228 * (auVar283._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar346 + fVar250 * (auVar283._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar347 + auVar283._28_4_ + 7.0;
      auVar45._4_4_ = auVar333._4_4_ * 0.99999976;
      auVar45._0_4_ = auVar333._0_4_ * 0.99999976;
      auVar45._8_4_ = auVar333._8_4_ * 0.99999976;
      auVar45._12_4_ = auVar333._12_4_ * 0.99999976;
      auVar45._16_4_ = auVar333._16_4_ * 0.99999976;
      auVar45._20_4_ = auVar333._20_4_ * 0.99999976;
      auVar45._24_4_ = auVar333._24_4_ * 0.99999976;
      auVar45._28_4_ = 0x3f7ffffc;
      auVar283 = vmaxps_avx(ZEXT1232(auVar58) << 0x20,auVar45);
      auVar46._4_4_ = auVar283._4_4_ * auVar283._4_4_;
      auVar46._0_4_ = auVar283._0_4_ * auVar283._0_4_;
      auVar46._8_4_ = auVar283._8_4_ * auVar283._8_4_;
      auVar46._12_4_ = auVar283._12_4_ * auVar283._12_4_;
      auVar46._16_4_ = auVar283._16_4_ * auVar283._16_4_;
      auVar46._20_4_ = auVar283._20_4_ * auVar283._20_4_;
      auVar46._24_4_ = auVar283._24_4_ * auVar283._24_4_;
      auVar46._28_4_ = auVar283._28_4_;
      auVar333 = vsubps_avx(local_3c0,auVar46);
      auVar47._4_4_ = auVar333._4_4_ * (float)local_7a0._4_4_;
      auVar47._0_4_ = auVar333._0_4_ * (float)local_7a0._0_4_;
      auVar47._8_4_ = auVar333._8_4_ * fStack_798;
      auVar47._12_4_ = auVar333._12_4_ * fStack_794;
      auVar47._16_4_ = auVar333._16_4_ * fStack_790;
      auVar47._20_4_ = auVar333._20_4_ * fStack_78c;
      auVar47._24_4_ = auVar333._24_4_ * fStack_788;
      auVar47._28_4_ = auVar283._28_4_;
      auVar344 = vsubps_avx(local_680,auVar47);
      auVar283 = vcmpps_avx(auVar344,ZEXT832(0) << 0x20,5);
      if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar283 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar283 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar283 >> 0x7f,0) == '\0') &&
            (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar283 >> 0xbf,0) == '\0') &&
          (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar283[0x1f]) {
        auVar245 = ZEXT864(0) << 0x20;
        auVar260 = ZEXT832(0) << 0x20;
        auVar169 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar194 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar263._8_4_ = 0x7f800000;
        auVar263._0_8_ = 0x7f8000007f800000;
        auVar263._12_4_ = 0x7f800000;
        auVar263._16_4_ = 0x7f800000;
        auVar263._20_4_ = 0x7f800000;
        auVar263._24_4_ = 0x7f800000;
        auVar263._28_4_ = 0x7f800000;
        auVar291._8_4_ = 0xff800000;
        auVar291._0_8_ = 0xff800000ff800000;
        auVar291._12_4_ = 0xff800000;
        auVar291._16_4_ = 0xff800000;
        auVar291._20_4_ = 0xff800000;
        auVar291._24_4_ = 0xff800000;
        auVar291._28_4_ = 0xff800000;
      }
      else {
        local_800 = auVar333;
        local_a60 = auVar283;
        auVar136 = vrcpps_avx(local_320);
        fVar208 = auVar136._0_4_;
        fVar151 = auVar136._4_4_;
        auVar48._4_4_ = local_320._4_4_ * fVar151;
        auVar48._0_4_ = local_320._0_4_ * fVar208;
        fVar174 = auVar136._8_4_;
        auVar48._8_4_ = local_320._8_4_ * fVar174;
        fVar228 = auVar136._12_4_;
        auVar48._12_4_ = local_320._12_4_ * fVar228;
        fVar248 = auVar136._16_4_;
        auVar48._16_4_ = local_320._16_4_ * fVar248;
        fVar250 = auVar136._20_4_;
        auVar48._20_4_ = local_320._20_4_ * fVar250;
        fVar177 = auVar136._24_4_;
        auVar48._24_4_ = local_320._24_4_ * fVar177;
        auVar48._28_4_ = local_1e0._28_4_;
        auVar260 = vsubps_avx(auVar335,auVar48);
        auVar286 = vsqrtps_avx(auVar344);
        fVar208 = fVar208 + fVar208 * auVar260._0_4_;
        fVar151 = fVar151 + fVar151 * auVar260._4_4_;
        fVar174 = fVar174 + fVar174 * auVar260._8_4_;
        fVar228 = fVar228 + fVar228 * auVar260._12_4_;
        fVar248 = fVar248 + fVar248 * auVar260._16_4_;
        fVar250 = fVar250 + fVar250 * auVar260._20_4_;
        fVar177 = fVar177 + fVar177 * auVar260._24_4_;
        auVar169 = vsubps_avx(local_480,auVar286);
        fVar343 = auVar169._0_4_ * fVar208;
        fVar234 = auVar169._4_4_ * fVar151;
        auVar49._4_4_ = fVar234;
        auVar49._0_4_ = fVar343;
        fVar346 = auVar169._8_4_ * fVar174;
        auVar49._8_4_ = fVar346;
        fVar247 = auVar169._12_4_ * fVar228;
        auVar49._12_4_ = fVar247;
        fVar347 = auVar169._16_4_ * fVar248;
        auVar49._16_4_ = fVar347;
        fVar249 = auVar169._20_4_ * fVar250;
        auVar49._20_4_ = fVar249;
        fVar251 = auVar169._24_4_ * fVar177;
        auVar49._24_4_ = fVar251;
        auVar49._28_4_ = 0x80000000;
        auVar169 = vsubps_avx(auVar286,local_460);
        fVar208 = auVar169._0_4_ * fVar208;
        fVar151 = auVar169._4_4_ * fVar151;
        auVar50._4_4_ = fVar151;
        auVar50._0_4_ = fVar208;
        fVar174 = auVar169._8_4_ * fVar174;
        auVar50._8_4_ = fVar174;
        fVar228 = auVar169._12_4_ * fVar228;
        auVar50._12_4_ = fVar228;
        fVar248 = auVar169._16_4_ * fVar248;
        auVar50._16_4_ = fVar248;
        fVar250 = auVar169._20_4_ * fVar250;
        auVar50._20_4_ = fVar250;
        fVar177 = auVar169._24_4_ * fVar177;
        auVar50._24_4_ = fVar177;
        auVar50._28_4_ = 0x3f800000;
        fVar126 = local_420 * (fVar343 * local_520 + (float)local_6c0._0_4_);
        fVar182 = fStack_41c * (fVar234 * fStack_51c + (float)local_6c0._4_4_);
        fVar204 = fStack_418 * (fVar346 * fStack_518 + fStack_6b8);
        fVar225 = fStack_414 * (fVar247 * fStack_514 + fStack_6b4);
        fVar231 = fStack_410 * (fVar347 * fStack_510 + fStack_6b0);
        fVar149 = fStack_40c * (fVar249 * fStack_50c + fStack_6ac);
        fVar232 = fStack_408 * (fVar251 * fStack_508 + fStack_6a8);
        auVar170._0_4_ = auVar348._0_4_ + fVar226 * fVar126;
        auVar170._4_4_ = auVar348._4_4_ + fVar246 * fVar182;
        auVar170._8_4_ = auVar348._8_4_ + fVar175 * fVar204;
        auVar170._12_4_ = auVar348._12_4_ + fVar180 * fVar225;
        auVar170._16_4_ = auVar348._16_4_ + fVar203 * fVar231;
        auVar170._20_4_ = auVar348._20_4_ + fVar209 * fVar149;
        auVar170._24_4_ = auVar348._24_4_ + fVar230 * fVar232;
        auVar170._28_4_ = auVar348._28_4_ + auVar169._28_4_;
        auVar51._4_4_ = fStack_4bc * fVar234;
        auVar51._0_4_ = local_4c0 * fVar343;
        auVar51._8_4_ = fStack_4b8 * fVar346;
        auVar51._12_4_ = fStack_4b4 * fVar247;
        auVar51._16_4_ = fStack_4b0 * fVar347;
        auVar51._20_4_ = fStack_4ac * fVar249;
        auVar51._24_4_ = fStack_4a8 * fVar251;
        auVar51._28_4_ = auVar286._28_4_;
        auVar169 = vsubps_avx(auVar51,auVar170);
        _local_aa0 = auVar169;
        auVar196._0_4_ = local_600._0_4_ + fVar224 * fVar126;
        auVar196._4_4_ = local_600._4_4_ + fVar176 * fVar182;
        auVar196._8_4_ = local_600._8_4_ + fVar152 * fVar204;
        auVar196._12_4_ = local_600._12_4_ + fVar178 * fVar225;
        auVar196._16_4_ = local_600._16_4_ + fVar201 * fVar231;
        auVar196._20_4_ = local_600._20_4_ + fVar205 * fVar149;
        auVar196._24_4_ = local_600._24_4_ + fVar227 * fVar232;
        auVar196._28_4_ = local_600._28_4_ + auVar286._28_4_;
        auVar52._4_4_ = fVar234 * fStack_75c;
        auVar52._0_4_ = fVar343 * local_760;
        auVar52._8_4_ = fVar346 * fStack_758;
        auVar52._12_4_ = fVar247 * fStack_754;
        auVar52._16_4_ = fVar347 * fStack_750;
        auVar52._20_4_ = fVar249 * fStack_74c;
        auVar52._24_4_ = fVar251 * fStack_748;
        auVar52._28_4_ = 0x3e000000;
        local_a00 = vsubps_avx(auVar52,auVar196);
        auVar137._0_4_ = local_5e0._0_4_ + fVar172 * fVar126;
        auVar137._4_4_ = local_5e0._4_4_ + fVar233 * fVar182;
        auVar137._8_4_ = local_5e0._8_4_ + fVar173 * fVar204;
        auVar137._12_4_ = local_5e0._12_4_ + fVar179 * fVar225;
        auVar137._16_4_ = local_5e0._16_4_ + fVar202 * fVar231;
        auVar137._20_4_ = local_5e0._20_4_ + fVar206 * fVar149;
        auVar137._24_4_ = local_5e0._24_4_ + fVar229 * fVar232;
        auVar137._28_4_ = local_5e0._28_4_ + auVar136._28_4_ + auVar260._28_4_ + fStack_6a4;
        auVar53._4_4_ = fStack_77c * fVar234;
        auVar53._0_4_ = local_780 * fVar343;
        auVar53._8_4_ = fStack_778 * fVar346;
        auVar53._12_4_ = fStack_774 * fVar247;
        auVar53._16_4_ = fStack_770 * fVar347;
        auVar53._20_4_ = fStack_76c * fVar249;
        auVar53._24_4_ = fStack_768 * fVar251;
        auVar53._28_4_ = 0x3e000000;
        _local_920 = vsubps_avx(auVar53,auVar137);
        fVar126 = local_420 * (fVar208 * local_520 + (float)local_6c0._0_4_);
        fVar182 = fStack_41c * (fVar151 * fStack_51c + (float)local_6c0._4_4_);
        fVar204 = fStack_418 * (fVar174 * fStack_518 + fStack_6b8);
        fVar225 = fStack_414 * (fVar228 * fStack_514 + fStack_6b4);
        fVar231 = fStack_410 * (fVar248 * fStack_510 + fStack_6b0);
        fVar149 = fStack_40c * (fVar250 * fStack_50c + fStack_6ac);
        fVar232 = fStack_408 * (fVar177 * fStack_508 + fStack_6a8);
        auVar138._0_4_ = auVar348._0_4_ + fVar226 * fVar126;
        auVar138._4_4_ = auVar348._4_4_ + fVar246 * fVar182;
        auVar138._8_4_ = auVar348._8_4_ + fVar175 * fVar204;
        auVar138._12_4_ = auVar348._12_4_ + fVar180 * fVar225;
        auVar138._16_4_ = auVar348._16_4_ + fVar203 * fVar231;
        auVar138._20_4_ = auVar348._20_4_ + fVar209 * fVar149;
        auVar138._24_4_ = auVar348._24_4_ + fVar230 * fVar232;
        auVar138._28_4_ = auVar348._28_4_ + local_920._28_4_ + fStack_6a4;
        auVar54._4_4_ = fStack_4bc * fVar151;
        auVar54._0_4_ = local_4c0 * fVar208;
        auVar54._8_4_ = fStack_4b8 * fVar174;
        auVar54._12_4_ = fStack_4b4 * fVar228;
        auVar54._16_4_ = fStack_4b0 * fVar248;
        auVar54._20_4_ = fStack_4ac * fVar250;
        auVar54._24_4_ = fStack_4a8 * fVar177;
        auVar54._28_4_ = fStack_404;
        auVar136 = vsubps_avx(auVar54,auVar138);
        auVar244._0_4_ = local_600._0_4_ + fVar224 * fVar126;
        auVar244._4_4_ = local_600._4_4_ + fVar176 * fVar182;
        auVar244._8_4_ = local_600._8_4_ + fVar152 * fVar204;
        auVar244._12_4_ = local_600._12_4_ + fVar178 * fVar225;
        auVar244._16_4_ = local_600._16_4_ + fVar201 * fVar231;
        auVar244._20_4_ = local_600._20_4_ + fVar205 * fVar149;
        auVar244._24_4_ = local_600._24_4_ + fVar227 * fVar232;
        auVar244._28_4_ = local_600._28_4_ + fStack_404;
        auVar55._4_4_ = fVar151 * fStack_75c;
        auVar55._0_4_ = fVar208 * local_760;
        auVar55._8_4_ = fVar174 * fStack_758;
        auVar55._12_4_ = fVar228 * fStack_754;
        auVar55._16_4_ = fVar248 * fStack_750;
        auVar55._20_4_ = fVar250 * fStack_74c;
        auVar55._24_4_ = fVar177 * fStack_748;
        auVar55._28_4_ = fStack_744;
        auVar286 = vsubps_avx(auVar55,auVar244);
        auVar245 = ZEXT3264(auVar286);
        auVar220._0_4_ = local_5e0._0_4_ + fVar172 * fVar126;
        auVar220._4_4_ = local_5e0._4_4_ + fVar233 * fVar182;
        auVar220._8_4_ = local_5e0._8_4_ + fVar173 * fVar204;
        auVar220._12_4_ = local_5e0._12_4_ + fVar179 * fVar225;
        auVar220._16_4_ = local_5e0._16_4_ + fVar202 * fVar231;
        auVar220._20_4_ = local_5e0._20_4_ + fVar206 * fVar149;
        auVar220._24_4_ = local_5e0._24_4_ + fVar229 * fVar232;
        auVar220._28_4_ = local_5e0._28_4_ + 0.125;
        auVar56._4_4_ = fStack_77c * fVar151;
        auVar56._0_4_ = local_780 * fVar208;
        auVar56._8_4_ = fStack_778 * fVar174;
        auVar56._12_4_ = fStack_774 * fVar228;
        auVar56._16_4_ = fStack_770 * fVar248;
        auVar56._20_4_ = fStack_76c * fVar250;
        auVar56._24_4_ = fStack_768 * fVar177;
        auVar56._28_4_ = fStack_744;
        auVar260 = vsubps_avx(auVar56,auVar220);
        auVar344 = vcmpps_avx(auVar344,_DAT_01f7b000,5);
        auVar264._8_4_ = 0x7f800000;
        auVar264._0_8_ = 0x7f8000007f800000;
        auVar264._12_4_ = 0x7f800000;
        auVar264._16_4_ = 0x7f800000;
        auVar264._20_4_ = 0x7f800000;
        auVar264._24_4_ = 0x7f800000;
        auVar264._28_4_ = 0x7f800000;
        auVar263 = vblendvps_avx(auVar264,auVar49,auVar344);
        auVar286 = vmaxps_avx(local_500,local_440);
        auVar57._4_4_ = auVar286._4_4_ * 1.9073486e-06;
        auVar57._0_4_ = auVar286._0_4_ * 1.9073486e-06;
        auVar57._8_4_ = auVar286._8_4_ * 1.9073486e-06;
        auVar57._12_4_ = auVar286._12_4_ * 1.9073486e-06;
        auVar57._16_4_ = auVar286._16_4_ * 1.9073486e-06;
        auVar57._20_4_ = auVar286._20_4_ * 1.9073486e-06;
        auVar57._24_4_ = auVar286._24_4_ * 1.9073486e-06;
        auVar57._28_4_ = auVar286._28_4_;
        auVar286 = vcmpps_avx(local_940,auVar57,1);
        auVar292._8_4_ = 0xff800000;
        auVar292._0_8_ = 0xff800000ff800000;
        auVar292._12_4_ = 0xff800000;
        auVar292._16_4_ = 0xff800000;
        auVar292._20_4_ = 0xff800000;
        auVar292._24_4_ = 0xff800000;
        auVar292._28_4_ = 0xff800000;
        auVar291 = vblendvps_avx(auVar292,auVar50,auVar344);
        auVar11 = auVar344 & auVar286;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar283 = vandps_avx(auVar286,auVar344);
          auVar84 = vpackssdw_avx(auVar283._0_16_,auVar283._16_16_);
          auVar286 = vcmpps_avx(auVar333,_DAT_01f7b000,2);
          auVar171._8_4_ = 0xff800000;
          auVar171._0_8_ = 0xff800000ff800000;
          auVar171._12_4_ = 0xff800000;
          auVar171._16_4_ = 0xff800000;
          auVar171._20_4_ = 0xff800000;
          auVar171._24_4_ = 0xff800000;
          auVar171._28_4_ = 0xff800000;
          auVar200._8_4_ = 0x7f800000;
          auVar200._0_8_ = 0x7f8000007f800000;
          auVar200._12_4_ = 0x7f800000;
          auVar200._16_4_ = 0x7f800000;
          auVar200._20_4_ = 0x7f800000;
          auVar200._24_4_ = 0x7f800000;
          auVar200._28_4_ = 0x7f800000;
          auVar333 = vblendvps_avx(auVar200,auVar171,auVar286);
          auVar238 = vpmovsxwd_avx(auVar84);
          auVar84 = vpunpckhwd_avx(auVar84,auVar84);
          auVar336._16_16_ = auVar84;
          auVar336._0_16_ = auVar238;
          auVar263 = vblendvps_avx(auVar263,auVar333,auVar336);
          auVar333 = vblendvps_avx(auVar171,auVar200,auVar286);
          auVar291 = vblendvps_avx(auVar291,auVar333,auVar336);
          auVar119._0_8_ = auVar283._0_8_ ^ 0xffffffffffffffff;
          auVar119._8_4_ = auVar283._8_4_ ^ 0xffffffff;
          auVar119._12_4_ = auVar283._12_4_ ^ 0xffffffff;
          auVar119._16_4_ = auVar283._16_4_ ^ 0xffffffff;
          auVar119._20_4_ = auVar283._20_4_ ^ 0xffffffff;
          auVar119._24_4_ = auVar283._24_4_ ^ 0xffffffff;
          auVar119._28_4_ = auVar283._28_4_ ^ 0xffffffff;
          auVar283 = vorps_avx(auVar286,auVar119);
          auVar283 = vandps_avx(auVar344,auVar283);
        }
        auVar194 = local_a00._0_28_;
        auVar282 = local_920._0_28_;
      }
      fVar208 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar151 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar224 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_560 = local_6a0;
      local_540 = vminps_avx(local_580,auVar263);
      _local_5a0 = vmaxps_avx(local_6a0,auVar291);
      auVar294 = ZEXT3264(_local_5a0);
      auVar333 = vcmpps_avx(local_6a0,local_540,2);
      local_680 = vandps_avx(auVar107,auVar333);
      auVar333 = vcmpps_avx(_local_5a0,local_580,2);
      local_900 = vandps_avx(auVar107,auVar333);
      auVar317 = ZEXT3264(local_900);
      auVar107 = vorps_avx(local_900,local_680);
      if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0x7f,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0xbf,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar107[0x1f]) goto LAB_007d6699;
      local_840._0_8_ = uVar65;
      auVar90._0_4_ = fVar208 * auVar136._0_4_ + fVar151 * auVar245._0_4_ + fVar224 * auVar260._0_4_
      ;
      auVar90._4_4_ = fVar208 * auVar136._4_4_ + fVar151 * auVar245._4_4_ + fVar224 * auVar260._4_4_
      ;
      auVar90._8_4_ = fVar208 * auVar136._8_4_ + fVar151 * auVar245._8_4_ + fVar224 * auVar260._8_4_
      ;
      auVar90._12_4_ =
           fVar208 * auVar136._12_4_ + fVar151 * auVar245._12_4_ + fVar224 * auVar260._12_4_;
      auVar90._16_4_ =
           fVar208 * auVar136._16_4_ + fVar151 * auVar245._16_4_ + fVar224 * auVar260._16_4_;
      auVar90._20_4_ =
           fVar208 * auVar136._20_4_ + fVar151 * auVar245._20_4_ + fVar224 * auVar260._20_4_;
      auVar90._24_4_ =
           fVar208 * auVar136._24_4_ + fVar151 * auVar245._24_4_ + fVar224 * auVar260._24_4_;
      auVar90._28_4_ = auVar136._28_4_ + auVar260._28_4_ + auVar107._28_4_;
      auVar112._0_8_ = auVar283._0_8_ ^ 0xffffffffffffffff;
      auVar112._8_4_ = auVar283._8_4_ ^ 0xffffffff;
      auVar112._12_4_ = auVar283._12_4_ ^ 0xffffffff;
      auVar112._16_4_ = auVar283._16_4_ ^ 0xffffffff;
      auVar112._20_4_ = auVar283._20_4_ ^ 0xffffffff;
      auVar112._24_4_ = auVar283._24_4_ ^ 0xffffffff;
      auVar112._28_4_ = auVar283._28_4_ ^ 0xffffffff;
      auVar197._8_4_ = 0x7fffffff;
      auVar197._0_8_ = 0x7fffffff7fffffff;
      auVar197._12_4_ = 0x7fffffff;
      auVar197._16_4_ = 0x7fffffff;
      auVar197._20_4_ = 0x7fffffff;
      auVar197._24_4_ = 0x7fffffff;
      auVar197._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar90,auVar197);
      auVar221._8_4_ = 0x3e99999a;
      auVar221._0_8_ = 0x3e99999a3e99999a;
      auVar221._12_4_ = 0x3e99999a;
      auVar221._16_4_ = 0x3e99999a;
      auVar221._20_4_ = 0x3e99999a;
      auVar221._24_4_ = 0x3e99999a;
      auVar221._28_4_ = 0x3e99999a;
      auVar107 = vcmpps_avx(auVar107,auVar221,1);
      local_5e0 = vorps_avx(auVar107,auVar112);
      auVar91._0_4_ = fVar208 * auVar169._0_4_ + fVar151 * auVar194._0_4_ + auVar282._0_4_ * fVar224
      ;
      auVar91._4_4_ = fVar208 * auVar169._4_4_ + fVar151 * auVar194._4_4_ + auVar282._4_4_ * fVar224
      ;
      auVar91._8_4_ = fVar208 * auVar169._8_4_ + fVar151 * auVar194._8_4_ + auVar282._8_4_ * fVar224
      ;
      auVar91._12_4_ =
           fVar208 * auVar169._12_4_ + fVar151 * auVar194._12_4_ + auVar282._12_4_ * fVar224;
      auVar91._16_4_ =
           fVar208 * auVar169._16_4_ + fVar151 * auVar194._16_4_ + auVar282._16_4_ * fVar224;
      auVar91._20_4_ =
           fVar208 * auVar169._20_4_ + fVar151 * auVar194._20_4_ + auVar282._20_4_ * fVar224;
      auVar91._24_4_ =
           fVar208 * auVar169._24_4_ + fVar151 * auVar194._24_4_ + auVar282._24_4_ * fVar224;
      auVar91._28_4_ = auVar136._28_4_ + auVar169._28_4_ + local_5e0._28_4_;
      auVar107 = vandps_avx(auVar91,auVar197);
      auVar107 = vcmpps_avx(auVar107,auVar221,1);
      auVar107 = vorps_avx(auVar107,auVar112);
      auVar113._8_4_ = 3;
      auVar113._0_8_ = 0x300000003;
      auVar113._12_4_ = 3;
      auVar113._16_4_ = 3;
      auVar113._20_4_ = 3;
      auVar113._24_4_ = 3;
      auVar113._28_4_ = 3;
      auVar140._8_4_ = 2;
      auVar140._0_8_ = 0x200000002;
      auVar140._12_4_ = 2;
      auVar140._16_4_ = 2;
      auVar140._20_4_ = 2;
      auVar140._24_4_ = 2;
      auVar140._28_4_ = 2;
      auVar107 = vblendvps_avx(auVar140,auVar113,auVar107);
      local_600 = ZEXT432(local_b2c);
      auVar238 = vpshufd_avx(ZEXT416(local_b2c),0);
      auVar84 = vpcmpgtd_avx(auVar107._16_16_,auVar238);
      local_620._0_16_ = auVar238;
      auVar238 = vpcmpgtd_avx(auVar107._0_16_,auVar238);
      auVar114._16_16_ = auVar84;
      auVar114._0_16_ = auVar238;
      _local_6c0 = vblendps_avx(ZEXT1632(auVar238),auVar114,0xf0);
      auVar107 = vandnps_avx(_local_6c0,local_680);
      local_7a0._4_4_ = local_6a0._4_4_ + (float)local_660._4_4_;
      local_7a0._0_4_ = local_6a0._0_4_ + (float)local_660._0_4_;
      fStack_798 = local_6a0._8_4_ + fStack_658;
      fStack_794 = local_6a0._12_4_ + fStack_654;
      fStack_790 = local_6a0._16_4_ + fStack_650;
      fStack_78c = local_6a0._20_4_ + fStack_64c;
      fStack_788 = local_6a0._24_4_ + fStack_648;
      fStack_784 = local_6a0._28_4_ + fStack_644;
      local_a80 = _local_5a0;
      local_9c0 = auVar13;
      while( true ) {
        local_4a0 = auVar107;
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) break;
        auVar115._8_4_ = 0x7f800000;
        auVar115._0_8_ = 0x7f8000007f800000;
        auVar115._12_4_ = 0x7f800000;
        auVar115._16_4_ = 0x7f800000;
        auVar115._20_4_ = 0x7f800000;
        auVar115._24_4_ = 0x7f800000;
        auVar115._28_4_ = 0x7f800000;
        auVar283 = vblendvps_avx(auVar115,local_6a0,auVar107);
        auVar333 = vshufps_avx(auVar283,auVar283,0xb1);
        auVar333 = vminps_avx(auVar283,auVar333);
        auVar344 = vshufpd_avx(auVar333,auVar333,5);
        auVar333 = vminps_avx(auVar333,auVar344);
        auVar344 = vperm2f128_avx(auVar333,auVar333,1);
        auVar333 = vminps_avx(auVar333,auVar344);
        auVar283 = vcmpps_avx(auVar283,auVar333,0);
        auVar333 = auVar107 & auVar283;
        if ((((((((auVar333 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar333 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar333 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar333 >> 0x7f,0) != '\0') ||
              (auVar333 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar333 >> 0xbf,0) != '\0') ||
            (auVar333 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar333[0x1f] < '\0') {
          auVar107 = vandps_avx(auVar283,auVar107);
        }
        uVar62 = vmovmskps_avx(auVar107);
        uVar68 = 0;
        if (uVar62 != 0) {
          for (; (uVar62 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
          }
        }
        uVar65 = (ulong)uVar68;
        *(undefined4 *)(local_4a0 + uVar65 * 4) = 0;
        aVar5 = (ray->super_RayK<1>).dir.field_0;
        _local_aa0 = (undefined1  [16])aVar5;
        auVar84 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
        fVar208 = local_1a0[uVar65];
        uVar68 = *(uint *)(local_560 + uVar65 * 4);
        if (auVar84._0_4_ < 0.0) {
          fVar151 = sqrtf(auVar84._0_4_);
          auVar317 = ZEXT3264(local_900);
          auVar294 = ZEXT3264(local_a80);
        }
        else {
          auVar84 = vsqrtss_avx(auVar84,auVar84);
          fVar151 = auVar84._0_4_;
        }
        auVar238 = vminps_avx(_local_a10,_local_a30);
        auVar84 = vmaxps_avx(_local_a10,_local_a30);
        auVar10 = vminps_avx(_local_a20,_local_a40);
        auVar79 = vminps_avx(auVar238,auVar10);
        auVar238 = vmaxps_avx(_local_a20,_local_a40);
        auVar10 = vmaxps_avx(auVar84,auVar238);
        auVar155._8_4_ = 0x7fffffff;
        auVar155._0_8_ = 0x7fffffff7fffffff;
        auVar155._12_4_ = 0x7fffffff;
        auVar84 = vandps_avx(auVar79,auVar155);
        auVar238 = vandps_avx(auVar10,auVar155);
        auVar84 = vmaxps_avx(auVar84,auVar238);
        auVar238 = vmovshdup_avx(auVar84);
        auVar238 = vmaxss_avx(auVar238,auVar84);
        auVar84 = vshufpd_avx(auVar84,auVar84,1);
        auVar84 = vmaxss_avx(auVar84,auVar238);
        local_a00._0_4_ = auVar84._0_4_ * 1.9073486e-06;
        local_860._0_4_ = fVar151 * 1.9073486e-06;
        _local_740 = vshufps_avx(auVar10,auVar10,0xff);
        auVar84 = vinsertps_avx(ZEXT416(uVar68),ZEXT416((uint)fVar208),0x10);
        auVar245 = ZEXT1664(auVar84);
        lVar64 = 5;
        do {
          do {
            bVar71 = lVar64 == 0;
            lVar64 = lVar64 + -1;
            if (bVar71) goto LAB_007d7091;
            auVar238 = auVar245._0_16_;
            local_a60._0_16_ = vmovshdup_avx(auVar238);
            fVar226 = 1.0 - local_a60._0_4_;
            auVar84 = vshufps_avx(auVar238,auVar238,0x55);
            fVar208 = auVar84._0_4_;
            fVar151 = auVar84._4_4_;
            fVar224 = auVar84._8_4_;
            fVar172 = auVar84._12_4_;
            auVar84 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
            fVar174 = auVar84._0_4_;
            fVar228 = auVar84._4_4_;
            fVar176 = auVar84._8_4_;
            fVar233 = auVar84._12_4_;
            fVar246 = (float)local_a20._0_4_ * fVar208 + (float)local_a30._0_4_ * fVar174;
            fVar248 = (float)local_a20._4_4_ * fVar151 + (float)local_a30._4_4_ * fVar228;
            fVar250 = fStack_a18 * fVar224 + fStack_a28 * fVar176;
            fVar152 = fStack_a14 * fVar172 + fStack_a24 * fVar233;
            auVar212._0_4_ =
                 fVar174 * ((float)local_a30._0_4_ * fVar208 + fVar174 * (float)local_a10._0_4_) +
                 fVar208 * fVar246;
            auVar212._4_4_ =
                 fVar228 * ((float)local_a30._4_4_ * fVar151 + fVar228 * (float)local_a10._4_4_) +
                 fVar151 * fVar248;
            auVar212._8_4_ =
                 fVar176 * (fStack_a28 * fVar224 + fVar176 * fStack_a08) + fVar224 * fVar250;
            auVar212._12_4_ =
                 fVar233 * (fStack_a24 * fVar172 + fVar233 * fStack_a04) + fVar172 * fVar152;
            auVar156._0_4_ =
                 fVar174 * fVar246 +
                 fVar208 * (fVar208 * (float)local_a40._0_4_ + (float)local_a20._0_4_ * fVar174);
            auVar156._4_4_ =
                 fVar228 * fVar248 +
                 fVar151 * (fVar151 * (float)local_a40._4_4_ + (float)local_a20._4_4_ * fVar228);
            auVar156._8_4_ =
                 fVar176 * fVar250 + fVar224 * (fVar224 * fStack_a38 + fStack_a18 * fVar176);
            auVar156._12_4_ =
                 fVar233 * fVar152 + fVar172 * (fVar172 * fStack_a34 + fStack_a14 * fVar233);
            auVar84 = vshufps_avx(auVar238,auVar238,0);
            auVar97._0_4_ = auVar84._0_4_ * (float)local_aa0._0_4_ + 0.0;
            auVar97._4_4_ = auVar84._4_4_ * (float)local_aa0._4_4_ + 0.0;
            auVar97._8_4_ = auVar84._8_4_ * fStack_a98 + 0.0;
            auVar97._12_4_ = auVar84._12_4_ * fStack_a94 + 0.0;
            auVar78._0_4_ = fVar174 * auVar212._0_4_ + fVar208 * auVar156._0_4_;
            auVar78._4_4_ = fVar228 * auVar212._4_4_ + fVar151 * auVar156._4_4_;
            auVar78._8_4_ = fVar176 * auVar212._8_4_ + fVar224 * auVar156._8_4_;
            auVar78._12_4_ = fVar233 * auVar212._12_4_ + fVar172 * auVar156._12_4_;
            local_800._0_16_ = auVar78;
            auVar84 = vsubps_avx(auVar97,auVar78);
            _local_920 = auVar84;
            auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
            fVar208 = auVar84._0_4_;
            if (fVar208 < 0.0) {
              local_9a0._0_16_ = ZEXT416((uint)fVar226);
              local_9c0._0_16_ = auVar212;
              local_9e0._0_16_ = auVar156;
              fVar151 = sqrtf(fVar208);
              auVar245 = ZEXT1664(auVar238);
              auVar156 = local_9e0._0_16_;
              auVar212 = local_9c0._0_16_;
              fVar226 = (float)local_9a0._0_4_;
            }
            else {
              auVar10 = vsqrtss_avx(auVar84,auVar84);
              fVar151 = auVar10._0_4_;
            }
            auVar10 = vsubps_avx(auVar156,auVar212);
            auVar258._0_4_ = auVar10._0_4_ * 3.0;
            auVar258._4_4_ = auVar10._4_4_ * 3.0;
            auVar258._8_4_ = auVar10._8_4_ * 3.0;
            auVar258._12_4_ = auVar10._12_4_ * 3.0;
            fVar224 = local_a60._0_4_;
            auVar10 = vshufps_avx(ZEXT416((uint)(fVar224 * 6.0)),ZEXT416((uint)(fVar224 * 6.0)),0);
            auVar79 = ZEXT416((uint)((fVar226 - (fVar224 + fVar224)) * 6.0));
            auVar130 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)((fVar224 - (fVar226 + fVar226)) * 6.0));
            auVar157 = vshufps_avx(auVar79,auVar79,0);
            auVar73 = vshufps_avx(ZEXT416((uint)(fVar226 * 6.0)),ZEXT416((uint)(fVar226 * 6.0)),0);
            auVar79 = vdpps_avx(auVar258,auVar258,0x7f);
            auVar98._0_4_ =
                 auVar73._0_4_ * (float)local_a10._0_4_ +
                 auVar157._0_4_ * (float)local_a30._0_4_ +
                 auVar10._0_4_ * (float)local_a40._0_4_ + auVar130._0_4_ * (float)local_a20._0_4_;
            auVar98._4_4_ =
                 auVar73._4_4_ * (float)local_a10._4_4_ +
                 auVar157._4_4_ * (float)local_a30._4_4_ +
                 auVar10._4_4_ * (float)local_a40._4_4_ + auVar130._4_4_ * (float)local_a20._4_4_;
            auVar98._8_4_ =
                 auVar73._8_4_ * fStack_a08 +
                 auVar157._8_4_ * fStack_a28 +
                 auVar10._8_4_ * fStack_a38 + auVar130._8_4_ * fStack_a18;
            auVar98._12_4_ =
                 auVar73._12_4_ * fStack_a04 +
                 auVar157._12_4_ * fStack_a24 +
                 auVar10._12_4_ * fStack_a34 + auVar130._12_4_ * fStack_a14;
            auVar10 = vblendps_avx(auVar79,_DAT_01f45a50,0xe);
            auVar130 = vrsqrtss_avx(auVar10,auVar10);
            fVar172 = auVar130._0_4_;
            fVar224 = auVar79._0_4_;
            auVar130 = vdpps_avx(auVar258,auVar98,0x7f);
            auVar157 = vshufps_avx(auVar79,auVar79,0);
            auVar99._0_4_ = auVar98._0_4_ * auVar157._0_4_;
            auVar99._4_4_ = auVar98._4_4_ * auVar157._4_4_;
            auVar99._8_4_ = auVar98._8_4_ * auVar157._8_4_;
            auVar99._12_4_ = auVar98._12_4_ * auVar157._12_4_;
            auVar130 = vshufps_avx(auVar130,auVar130,0);
            auVar186._0_4_ = auVar258._0_4_ * auVar130._0_4_;
            auVar186._4_4_ = auVar258._4_4_ * auVar130._4_4_;
            auVar186._8_4_ = auVar258._8_4_ * auVar130._8_4_;
            auVar186._12_4_ = auVar258._12_4_ * auVar130._12_4_;
            auVar73 = vsubps_avx(auVar99,auVar186);
            auVar130 = vrcpss_avx(auVar10,auVar10);
            auVar10 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                 ZEXT416((uint)(auVar245._0_4_ * (float)local_860._0_4_)));
            auVar130 = ZEXT416((uint)(auVar130._0_4_ * (2.0 - fVar224 * auVar130._0_4_)));
            auVar130 = vshufps_avx(auVar130,auVar130,0);
            uVar65 = CONCAT44(auVar258._4_4_,auVar258._0_4_);
            auVar213._0_8_ = uVar65 ^ 0x8000000080000000;
            auVar213._8_4_ = -auVar258._8_4_;
            auVar213._12_4_ = -auVar258._12_4_;
            auVar157 = ZEXT416((uint)(fVar172 * 1.5 + fVar224 * -0.5 * fVar172 * fVar172 * fVar172))
            ;
            auVar157 = vshufps_avx(auVar157,auVar157,0);
            auVar158._0_4_ = auVar157._0_4_ * auVar73._0_4_ * auVar130._0_4_;
            auVar158._4_4_ = auVar157._4_4_ * auVar73._4_4_ * auVar130._4_4_;
            auVar158._8_4_ = auVar157._8_4_ * auVar73._8_4_ * auVar130._8_4_;
            auVar158._12_4_ = auVar157._12_4_ * auVar73._12_4_ * auVar130._12_4_;
            auVar239._0_4_ = auVar258._0_4_ * auVar157._0_4_;
            auVar239._4_4_ = auVar258._4_4_ * auVar157._4_4_;
            auVar239._8_4_ = auVar258._8_4_ * auVar157._8_4_;
            auVar239._12_4_ = auVar258._12_4_ * auVar157._12_4_;
            local_a60._0_16_ = auVar258;
            local_9a0._0_4_ = auVar10._0_4_;
            if (fVar224 < 0.0) {
              local_9c0._0_4_ = fVar151;
              local_9e0._0_16_ = auVar213;
              local_940._0_16_ = auVar239;
              local_820._0_16_ = auVar158;
              fVar172 = sqrtf(fVar224);
              auVar158 = local_820._0_16_;
              auVar213 = local_9e0._0_16_;
              auVar239 = local_940._0_16_;
              fVar151 = (float)local_9c0._0_4_;
              fVar224 = (float)local_9a0._0_4_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar172 = auVar79._0_4_;
              fVar224 = auVar10._0_4_;
            }
            auVar10 = vdpps_avx(_local_920,auVar239,0x7f);
            fVar151 = ((float)local_a00._0_4_ / fVar172) * (fVar151 + 1.0) +
                      fVar224 + fVar151 * (float)local_a00._0_4_;
            auVar79 = vdpps_avx(auVar213,auVar239,0x7f);
            auVar130 = vdpps_avx(_local_920,auVar158,0x7f);
            auVar157 = vdpps_avx(_local_aa0,auVar239,0x7f);
            auVar73 = vdpps_avx(_local_920,auVar213,0x7f);
            fVar172 = auVar79._0_4_ + auVar130._0_4_;
            fVar226 = auVar10._0_4_;
            auVar80._0_4_ = fVar226 * fVar226;
            auVar80._4_4_ = auVar10._4_4_ * auVar10._4_4_;
            auVar80._8_4_ = auVar10._8_4_ * auVar10._8_4_;
            auVar80._12_4_ = auVar10._12_4_ * auVar10._12_4_;
            auVar130 = vsubps_avx(auVar84,auVar80);
            auVar79 = vdpps_avx(_local_920,_local_aa0,0x7f);
            fVar174 = auVar73._0_4_ - fVar226 * fVar172;
            fVar228 = auVar79._0_4_ - fVar226 * auVar157._0_4_;
            auVar79 = vrsqrtss_avx(auVar130,auVar130);
            fVar176 = auVar130._0_4_;
            fVar226 = auVar79._0_4_;
            fVar226 = fVar226 * 1.5 + fVar176 * -0.5 * fVar226 * fVar226 * fVar226;
            if (fVar176 < 0.0) {
              local_9c0._0_16_ = auVar10;
              local_9e0._0_4_ = fVar151;
              local_940._0_16_ = auVar157;
              local_820._0_16_ = ZEXT416((uint)fVar172);
              local_6e0._0_4_ = fVar174;
              local_700._0_4_ = fVar228;
              local_720._0_4_ = fVar226;
              fVar176 = sqrtf(fVar176);
              fVar226 = (float)local_720._0_4_;
              fVar174 = (float)local_6e0._0_4_;
              fVar228 = (float)local_700._0_4_;
              auVar157 = local_940._0_16_;
              auVar10 = local_9c0._0_16_;
              fVar151 = (float)local_9e0._0_4_;
              fVar224 = (float)local_9a0._0_4_;
              auVar79 = local_820._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar130,auVar130);
              fVar176 = auVar79._0_4_;
              auVar79 = ZEXT416((uint)fVar172);
            }
            auVar294 = ZEXT3264(local_a80);
            auVar317 = ZEXT3264(local_900);
            auVar73 = vpermilps_avx(local_800._0_16_,0xff);
            auVar74 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
            fVar172 = fVar174 * fVar226 - auVar74._0_4_;
            auVar187._0_8_ = auVar157._0_8_ ^ 0x8000000080000000;
            auVar187._8_4_ = auVar157._8_4_ ^ 0x80000000;
            auVar187._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar214._0_4_ = -fVar172;
            auVar214._4_4_ = 0x80000000;
            auVar214._8_4_ = 0x80000000;
            auVar214._12_4_ = 0x80000000;
            auVar130 = vinsertps_avx(auVar214,ZEXT416((uint)(fVar228 * fVar226)),0x1c);
            auVar157 = vmovsldup_avx(ZEXT416((uint)(auVar79._0_4_ * fVar228 * fVar226 -
                                                   auVar157._0_4_ * fVar172)));
            auVar130 = vdivps_avx(auVar130,auVar157);
            auVar79 = vinsertps_avx(auVar79,auVar187,0x10);
            auVar79 = vdivps_avx(auVar79,auVar157);
            auVar157 = vmovsldup_avx(auVar10);
            auVar81 = ZEXT416((uint)(fVar176 - auVar73._0_4_));
            auVar73 = vmovsldup_avx(auVar81);
            auVar131._0_4_ = auVar157._0_4_ * auVar130._0_4_ + auVar73._0_4_ * auVar79._0_4_;
            auVar131._4_4_ = auVar157._4_4_ * auVar130._4_4_ + auVar73._4_4_ * auVar79._4_4_;
            auVar131._8_4_ = auVar157._8_4_ * auVar130._8_4_ + auVar73._8_4_ * auVar79._8_4_;
            auVar131._12_4_ = auVar157._12_4_ * auVar130._12_4_ + auVar73._12_4_ * auVar79._12_4_;
            auVar79 = vsubps_avx(auVar238,auVar131);
            auVar245 = ZEXT1664(auVar79);
            auVar132._8_4_ = 0x7fffffff;
            auVar132._0_8_ = 0x7fffffff7fffffff;
            auVar132._12_4_ = 0x7fffffff;
            auVar238 = vandps_avx(auVar10,auVar132);
          } while (fVar151 <= auVar238._0_4_);
          auVar159._8_4_ = 0x7fffffff;
          auVar159._0_8_ = 0x7fffffff7fffffff;
          auVar159._12_4_ = 0x7fffffff;
          auVar238 = vandps_avx(auVar81,auVar159);
        } while ((float)local_740._0_4_ * 1.9073486e-06 + fVar224 + fVar151 <= auVar238._0_4_);
        fVar151 = auVar79._0_4_ + (float)local_7e0._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar151) &&
           (fVar224 = (ray->super_RayK<1>).tfar, fVar151 <= fVar224)) {
          auVar238 = vmovshdup_avx(auVar79);
          fVar172 = auVar238._0_4_;
          if ((0.0 <= fVar172) && (fVar172 <= 1.0)) {
            auVar84 = vrsqrtss_avx(auVar84,auVar84);
            fVar226 = auVar84._0_4_;
            pGVar7 = (context->scene->geometries).items[uVar67].ptr;
            if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar84 = ZEXT416((uint)(fVar226 * 1.5 + fVar208 * -0.5 * fVar226 * fVar226 * fVar226)
                               );
              auVar84 = vshufps_avx(auVar84,auVar84,0);
              auVar160._0_4_ = auVar84._0_4_ * (float)local_920._0_4_;
              auVar160._4_4_ = auVar84._4_4_ * (float)local_920._4_4_;
              auVar160._8_4_ = auVar84._8_4_ * fStack_918;
              auVar160._12_4_ = auVar84._12_4_ * fStack_914;
              auVar100._0_4_ = local_a60._0_4_ + auVar74._0_4_ * auVar160._0_4_;
              auVar100._4_4_ = local_a60._4_4_ + auVar74._4_4_ * auVar160._4_4_;
              auVar100._8_4_ = local_a60._8_4_ + auVar74._8_4_ * auVar160._8_4_;
              auVar100._12_4_ = local_a60._12_4_ + auVar74._12_4_ * auVar160._12_4_;
              auVar84 = vshufps_avx(auVar160,auVar160,0xc9);
              auVar238 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
              auVar161._0_4_ = auVar238._0_4_ * auVar160._0_4_;
              auVar161._4_4_ = auVar238._4_4_ * auVar160._4_4_;
              auVar161._8_4_ = auVar238._8_4_ * auVar160._8_4_;
              auVar161._12_4_ = auVar238._12_4_ * auVar160._12_4_;
              auVar188._0_4_ = local_a60._0_4_ * auVar84._0_4_;
              auVar188._4_4_ = local_a60._4_4_ * auVar84._4_4_;
              auVar188._8_4_ = local_a60._8_4_ * auVar84._8_4_;
              auVar188._12_4_ = local_a60._12_4_ * auVar84._12_4_;
              auVar10 = vsubps_avx(auVar188,auVar161);
              auVar84 = vshufps_avx(auVar10,auVar10,0xc9);
              auVar238 = vshufps_avx(auVar100,auVar100,0xc9);
              auVar189._0_4_ = auVar238._0_4_ * auVar84._0_4_;
              auVar189._4_4_ = auVar238._4_4_ * auVar84._4_4_;
              auVar189._8_4_ = auVar238._8_4_ * auVar84._8_4_;
              auVar189._12_4_ = auVar238._12_4_ * auVar84._12_4_;
              auVar84 = vshufps_avx(auVar10,auVar10,0xd2);
              auVar101._0_4_ = auVar100._0_4_ * auVar84._0_4_;
              auVar101._4_4_ = auVar100._4_4_ * auVar84._4_4_;
              auVar101._8_4_ = auVar100._8_4_ * auVar84._8_4_;
              auVar101._12_4_ = auVar100._12_4_ * auVar84._12_4_;
              auVar238 = vsubps_avx(auVar189,auVar101);
              auVar84 = vshufps_avx(auVar238,auVar238,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar151;
                uVar2 = vmovlps_avx(auVar84);
                *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                (ray->Ng).field_0.field_0.z = auVar238._0_4_;
                ray->u = fVar172;
                ray->v = 0.0;
                ray->primID = local_840._0_4_;
                ray->geomID = uVar67;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_970 = vmovlps_avx(auVar84);
                local_968 = auVar238._0_4_;
                local_964 = fVar172;
                local_960 = 0;
                local_95c = local_840._0_4_;
                local_958 = uVar67;
                local_954 = context->user->instID[0];
                local_950 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar151;
                local_640._0_4_ = 0xffffffff;
                local_ad8.valid = (int *)local_640;
                local_ad8.geometryUserPtr = pGVar7->userPtr;
                local_ad8.context = context->user;
                local_ad8.hit = (RTCHitN *)&local_970;
                local_ad8.N = 1;
                local_ad8.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007d71a1:
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&local_ad8);
                    auVar317 = ZEXT3264(local_900);
                    auVar294 = ZEXT3264(local_a80);
                    if (*local_ad8.valid == 0) goto LAB_007d7244;
                  }
                  (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).components[0] =
                       *(float *)local_ad8.hit;
                  (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_ad8.hit + 4);
                  (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_ad8.hit + 8);
                  *(float *)((long)local_ad8.ray + 0x3c) = *(float *)(local_ad8.hit + 0xc);
                  *(float *)((long)local_ad8.ray + 0x40) = *(float *)(local_ad8.hit + 0x10);
                  *(float *)((long)local_ad8.ray + 0x44) = *(float *)(local_ad8.hit + 0x14);
                  *(float *)((long)local_ad8.ray + 0x48) = *(float *)(local_ad8.hit + 0x18);
                  *(float *)((long)local_ad8.ray + 0x4c) = *(float *)(local_ad8.hit + 0x1c);
                  *(float *)((long)local_ad8.ray + 0x50) = *(float *)(local_ad8.hit + 0x20);
                }
                else {
                  (*pGVar7->intersectionFilterN)(&local_ad8);
                  auVar317 = ZEXT3264(local_900);
                  auVar294 = ZEXT3264(local_a80);
                  if (*local_ad8.valid != 0) goto LAB_007d71a1;
LAB_007d7244:
                  (ray->super_RayK<1>).tfar = fVar224;
                }
              }
            }
          }
        }
LAB_007d7091:
        fVar208 = (ray->super_RayK<1>).tfar;
        auVar92._4_4_ = fVar208;
        auVar92._0_4_ = fVar208;
        auVar92._8_4_ = fVar208;
        auVar92._12_4_ = fVar208;
        auVar92._16_4_ = fVar208;
        auVar92._20_4_ = fVar208;
        auVar92._24_4_ = fVar208;
        auVar92._28_4_ = fVar208;
        auVar107 = vcmpps_avx(_local_7a0,auVar92,2);
        auVar107 = vandps_avx(auVar107,local_4a0);
      }
      auVar116._0_4_ = auVar294._0_4_ + (float)local_660._0_4_;
      auVar116._4_4_ = auVar294._4_4_ + (float)local_660._4_4_;
      auVar116._8_4_ = auVar294._8_4_ + fStack_658;
      auVar116._12_4_ = auVar294._12_4_ + fStack_654;
      auVar116._16_4_ = auVar294._16_4_ + fStack_650;
      auVar116._20_4_ = auVar294._20_4_ + fStack_64c;
      auVar116._24_4_ = auVar294._24_4_ + fStack_648;
      auVar116._28_4_ = auVar294._28_4_ + fStack_644;
      auVar107 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      fVar208 = (ray->super_RayK<1>).tfar;
      auVar141._4_4_ = fVar208;
      auVar141._0_4_ = fVar208;
      auVar141._8_4_ = fVar208;
      auVar141._12_4_ = fVar208;
      auVar141._16_4_ = fVar208;
      auVar141._20_4_ = fVar208;
      auVar141._24_4_ = fVar208;
      auVar141._28_4_ = fVar208;
      auVar283 = vcmpps_avx(auVar116,auVar141,2);
      local_6a0 = vandps_avx(auVar317._0_32_,auVar283);
      auVar117._8_4_ = 3;
      auVar117._0_8_ = 0x300000003;
      auVar117._12_4_ = 3;
      auVar117._16_4_ = 3;
      auVar117._20_4_ = 3;
      auVar117._24_4_ = 3;
      auVar117._28_4_ = 3;
      auVar142._8_4_ = 2;
      auVar142._0_8_ = 0x200000002;
      auVar142._12_4_ = 2;
      auVar142._16_4_ = 2;
      auVar142._20_4_ = 2;
      auVar142._24_4_ = 2;
      auVar142._28_4_ = 2;
      auVar283 = vblendvps_avx(auVar142,auVar117,local_5e0);
      auVar84 = vpcmpgtd_avx(auVar283._16_16_,local_620._0_16_);
      auVar238 = vpshufd_avx(local_600._0_16_,0);
      auVar238 = vpcmpgtd_avx(auVar283._0_16_,auVar238);
      auVar143._16_16_ = auVar84;
      auVar143._0_16_ = auVar107._0_16_;
      _local_7a0 = vblendps_avx(ZEXT1632(auVar238),auVar143,0xf0);
      auVar283 = vandnps_avx(_local_7a0,local_6a0);
      local_720 = _local_5a0;
      local_740._4_4_ = (float)local_660._4_4_ + (float)local_5a0._4_4_;
      local_740._0_4_ = (float)local_660._0_4_ + (float)local_5a0._0_4_;
      fStack_738 = fStack_658 + fStack_598;
      fStack_734 = fStack_654 + fStack_594;
      fStack_730 = fStack_650 + fStack_590;
      fStack_72c = fStack_64c + fStack_58c;
      fStack_728 = fStack_648 + fStack_588;
      fStack_724 = fStack_644 + fStack_584;
      auVar294 = ZEXT3264(local_880);
      auVar306 = ZEXT3264(local_8a0);
      auVar317 = ZEXT3264(local_8c0);
      auVar287 = ZEXT3264(local_8e0);
      while( true ) {
        local_640 = auVar283;
        if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar283 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar283 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar283 >> 0x7f,0) == '\0') &&
              (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar283 >> 0xbf,0) == '\0') &&
            (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar283[0x1f]) break;
        auVar93._8_4_ = 0x7f800000;
        auVar93._0_8_ = 0x7f8000007f800000;
        auVar93._12_4_ = 0x7f800000;
        auVar93._16_4_ = 0x7f800000;
        auVar93._20_4_ = 0x7f800000;
        auVar93._24_4_ = 0x7f800000;
        auVar93._28_4_ = 0x7f800000;
        auVar107 = vblendvps_avx(auVar93,local_720,auVar283);
        auVar333 = vshufps_avx(auVar107,auVar107,0xb1);
        auVar333 = vminps_avx(auVar107,auVar333);
        auVar344 = vshufpd_avx(auVar333,auVar333,5);
        auVar333 = vminps_avx(auVar333,auVar344);
        auVar344 = vperm2f128_avx(auVar333,auVar333,1);
        auVar333 = vminps_avx(auVar333,auVar344);
        auVar107 = vcmpps_avx(auVar107,auVar333,0);
        auVar333 = auVar283 & auVar107;
        if ((((((((auVar333 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar333 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar333 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar333 >> 0x7f,0) != '\0') ||
              (auVar333 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar333 >> 0xbf,0) != '\0') ||
            (auVar333 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar333[0x1f] < '\0') {
          auVar283 = vandps_avx(auVar107,auVar283);
        }
        uVar62 = vmovmskps_avx(auVar283);
        uVar68 = 0;
        if (uVar62 != 0) {
          for (; (uVar62 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
          }
        }
        uVar65 = (ulong)uVar68;
        *(undefined4 *)(local_640 + uVar65 * 4) = 0;
        aVar5 = (ray->super_RayK<1>).dir.field_0;
        _local_aa0 = (undefined1  [16])aVar5;
        auVar84 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
        fVar208 = local_1c0[uVar65];
        uVar68 = *(uint *)(local_580 + uVar65 * 4);
        if (auVar84._0_4_ < 0.0) {
          fVar151 = sqrtf(auVar84._0_4_);
          auVar287 = ZEXT3264(local_8e0);
          auVar317 = ZEXT3264(local_8c0);
          auVar306 = ZEXT3264(local_8a0);
          auVar294 = ZEXT3264(local_880);
        }
        else {
          auVar84 = vsqrtss_avx(auVar84,auVar84);
          fVar151 = auVar84._0_4_;
        }
        auVar238 = vminps_avx(_local_a10,_local_a30);
        auVar84 = vmaxps_avx(_local_a10,_local_a30);
        auVar10 = vminps_avx(_local_a20,_local_a40);
        auVar79 = vminps_avx(auVar238,auVar10);
        auVar238 = vmaxps_avx(_local_a20,_local_a40);
        auVar10 = vmaxps_avx(auVar84,auVar238);
        auVar162._8_4_ = 0x7fffffff;
        auVar162._0_8_ = 0x7fffffff7fffffff;
        auVar162._12_4_ = 0x7fffffff;
        auVar84 = vandps_avx(auVar79,auVar162);
        auVar238 = vandps_avx(auVar10,auVar162);
        auVar84 = vmaxps_avx(auVar84,auVar238);
        auVar238 = vmovshdup_avx(auVar84);
        auVar238 = vmaxss_avx(auVar238,auVar84);
        auVar84 = vshufpd_avx(auVar84,auVar84,1);
        auVar84 = vmaxss_avx(auVar84,auVar238);
        local_a00._0_4_ = auVar84._0_4_ * 1.9073486e-06;
        local_900._0_4_ = fVar151 * 1.9073486e-06;
        local_700._0_16_ = vshufps_avx(auVar10,auVar10,0xff);
        auVar84 = vinsertps_avx(ZEXT416(uVar68),ZEXT416((uint)fVar208),0x10);
        auVar245 = ZEXT1664(auVar84);
        lVar64 = 5;
        do {
          do {
            bVar71 = lVar64 == 0;
            lVar64 = lVar64 + -1;
            if (bVar71) goto LAB_007d7adc;
            auVar238 = auVar245._0_16_;
            local_a60._0_16_ = vmovshdup_avx(auVar238);
            fVar226 = 1.0 - local_a60._0_4_;
            auVar84 = vshufps_avx(auVar238,auVar238,0x55);
            fVar208 = auVar84._0_4_;
            fVar151 = auVar84._4_4_;
            fVar224 = auVar84._8_4_;
            fVar172 = auVar84._12_4_;
            auVar84 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
            fVar174 = auVar84._0_4_;
            fVar228 = auVar84._4_4_;
            fVar176 = auVar84._8_4_;
            fVar233 = auVar84._12_4_;
            fVar246 = (float)local_a20._0_4_ * fVar208 + (float)local_a30._0_4_ * fVar174;
            fVar248 = (float)local_a20._4_4_ * fVar151 + (float)local_a30._4_4_ * fVar228;
            fVar250 = fStack_a18 * fVar224 + fStack_a28 * fVar176;
            fVar152 = fStack_a14 * fVar172 + fStack_a24 * fVar233;
            auVar215._0_4_ =
                 fVar174 * ((float)local_a30._0_4_ * fVar208 + fVar174 * (float)local_a10._0_4_) +
                 fVar208 * fVar246;
            auVar215._4_4_ =
                 fVar228 * ((float)local_a30._4_4_ * fVar151 + fVar228 * (float)local_a10._4_4_) +
                 fVar151 * fVar248;
            auVar215._8_4_ =
                 fVar176 * (fStack_a28 * fVar224 + fVar176 * fStack_a08) + fVar224 * fVar250;
            auVar215._12_4_ =
                 fVar233 * (fStack_a24 * fVar172 + fVar233 * fStack_a04) + fVar172 * fVar152;
            local_a80._0_4_ =
                 fVar174 * fVar246 +
                 fVar208 * (fVar208 * (float)local_a40._0_4_ + (float)local_a20._0_4_ * fVar174);
            local_a80._4_4_ =
                 fVar228 * fVar248 +
                 fVar151 * (fVar151 * (float)local_a40._4_4_ + (float)local_a20._4_4_ * fVar228);
            local_a80._8_4_ =
                 fVar176 * fVar250 + fVar224 * (fVar224 * fStack_a38 + fStack_a18 * fVar176);
            local_a80._12_4_ =
                 fVar233 * fVar152 + fVar172 * (fVar172 * fStack_a34 + fStack_a14 * fVar233);
            auVar84 = vshufps_avx(auVar238,auVar238,0);
            auVar102._0_4_ = auVar84._0_4_ * (float)local_aa0._0_4_ + 0.0;
            auVar102._4_4_ = auVar84._4_4_ * (float)local_aa0._4_4_ + 0.0;
            auVar102._8_4_ = auVar84._8_4_ * fStack_a98 + 0.0;
            auVar102._12_4_ = auVar84._12_4_ * fStack_a94 + 0.0;
            auVar82._0_4_ = fVar174 * auVar215._0_4_ + fVar208 * local_a80._0_4_;
            auVar82._4_4_ = fVar228 * auVar215._4_4_ + fVar151 * local_a80._4_4_;
            auVar82._8_4_ = fVar176 * auVar215._8_4_ + fVar224 * local_a80._8_4_;
            auVar82._12_4_ = fVar233 * auVar215._12_4_ + fVar172 * local_a80._12_4_;
            local_800._0_16_ = auVar82;
            auVar84 = vsubps_avx(auVar102,auVar82);
            _local_920 = auVar84;
            auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
            fVar208 = auVar84._0_4_;
            if (fVar208 < 0.0) {
              local_9a0._0_16_ = ZEXT416((uint)fVar226);
              local_860._0_16_ = auVar215;
              fVar151 = sqrtf(fVar208);
              auVar245 = ZEXT1664(auVar238);
              auVar215 = local_860._0_16_;
              fVar226 = (float)local_9a0._0_4_;
            }
            else {
              auVar10 = vsqrtss_avx(auVar84,auVar84);
              fVar151 = auVar10._0_4_;
            }
            auVar10 = vsubps_avx(local_a80._0_16_,auVar215);
            auVar259._0_4_ = auVar10._0_4_ * 3.0;
            auVar259._4_4_ = auVar10._4_4_ * 3.0;
            auVar259._8_4_ = auVar10._8_4_ * 3.0;
            auVar259._12_4_ = auVar10._12_4_ * 3.0;
            fVar224 = local_a60._0_4_;
            auVar10 = vshufps_avx(ZEXT416((uint)(fVar224 * 6.0)),ZEXT416((uint)(fVar224 * 6.0)),0);
            auVar79 = ZEXT416((uint)((fVar226 - (fVar224 + fVar224)) * 6.0));
            auVar130 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)((fVar224 - (fVar226 + fVar226)) * 6.0));
            auVar157 = vshufps_avx(auVar79,auVar79,0);
            auVar73 = vshufps_avx(ZEXT416((uint)(fVar226 * 6.0)),ZEXT416((uint)(fVar226 * 6.0)),0);
            auVar79 = vdpps_avx(auVar259,auVar259,0x7f);
            auVar103._0_4_ =
                 auVar73._0_4_ * (float)local_a10._0_4_ +
                 auVar157._0_4_ * (float)local_a30._0_4_ +
                 auVar10._0_4_ * (float)local_a40._0_4_ + auVar130._0_4_ * (float)local_a20._0_4_;
            auVar103._4_4_ =
                 auVar73._4_4_ * (float)local_a10._4_4_ +
                 auVar157._4_4_ * (float)local_a30._4_4_ +
                 auVar10._4_4_ * (float)local_a40._4_4_ + auVar130._4_4_ * (float)local_a20._4_4_;
            auVar103._8_4_ =
                 auVar73._8_4_ * fStack_a08 +
                 auVar157._8_4_ * fStack_a28 +
                 auVar10._8_4_ * fStack_a38 + auVar130._8_4_ * fStack_a18;
            auVar103._12_4_ =
                 auVar73._12_4_ * fStack_a04 +
                 auVar157._12_4_ * fStack_a24 +
                 auVar10._12_4_ * fStack_a34 + auVar130._12_4_ * fStack_a14;
            auVar10 = vblendps_avx(auVar79,_DAT_01f45a50,0xe);
            auVar130 = vrsqrtss_avx(auVar10,auVar10);
            fVar172 = auVar130._0_4_;
            fVar224 = auVar79._0_4_;
            auVar130 = vdpps_avx(auVar259,auVar103,0x7f);
            auVar157 = vshufps_avx(auVar79,auVar79,0);
            auVar104._0_4_ = auVar103._0_4_ * auVar157._0_4_;
            auVar104._4_4_ = auVar103._4_4_ * auVar157._4_4_;
            auVar104._8_4_ = auVar103._8_4_ * auVar157._8_4_;
            auVar104._12_4_ = auVar103._12_4_ * auVar157._12_4_;
            auVar130 = vshufps_avx(auVar130,auVar130,0);
            auVar190._0_4_ = auVar259._0_4_ * auVar130._0_4_;
            auVar190._4_4_ = auVar259._4_4_ * auVar130._4_4_;
            auVar190._8_4_ = auVar259._8_4_ * auVar130._8_4_;
            auVar190._12_4_ = auVar259._12_4_ * auVar130._12_4_;
            auVar73 = vsubps_avx(auVar104,auVar190);
            auVar130 = vrcpss_avx(auVar10,auVar10);
            auVar10 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                 ZEXT416((uint)(auVar245._0_4_ * (float)local_900._0_4_)));
            auVar130 = ZEXT416((uint)(auVar130._0_4_ * (2.0 - fVar224 * auVar130._0_4_)));
            auVar130 = vshufps_avx(auVar130,auVar130,0);
            uVar65 = CONCAT44(auVar259._4_4_,auVar259._0_4_);
            local_a80._0_8_ = uVar65 ^ 0x8000000080000000;
            local_a80._8_4_ = -auVar259._8_4_;
            local_a80._12_4_ = -auVar259._12_4_;
            auVar157 = ZEXT416((uint)(fVar172 * 1.5 + fVar224 * -0.5 * fVar172 * fVar172 * fVar172))
            ;
            auVar157 = vshufps_avx(auVar157,auVar157,0);
            auVar163._0_4_ = auVar157._0_4_ * auVar73._0_4_ * auVar130._0_4_;
            auVar163._4_4_ = auVar157._4_4_ * auVar73._4_4_ * auVar130._4_4_;
            auVar163._8_4_ = auVar157._8_4_ * auVar73._8_4_ * auVar130._8_4_;
            auVar163._12_4_ = auVar157._12_4_ * auVar73._12_4_ * auVar130._12_4_;
            auVar240._0_4_ = auVar259._0_4_ * auVar157._0_4_;
            auVar240._4_4_ = auVar259._4_4_ * auVar157._4_4_;
            auVar240._8_4_ = auVar259._8_4_ * auVar157._8_4_;
            auVar240._12_4_ = auVar259._12_4_ * auVar157._12_4_;
            local_a60._0_16_ = auVar259;
            local_9a0._0_4_ = auVar10._0_4_;
            if (fVar224 < 0.0) {
              local_860._0_4_ = fVar151;
              local_9c0._0_16_ = auVar240;
              local_9e0._0_16_ = auVar163;
              fVar172 = sqrtf(fVar224);
              auVar163 = local_9e0._0_16_;
              auVar240 = local_9c0._0_16_;
              fVar151 = (float)local_860._0_4_;
              fVar224 = (float)local_9a0._0_4_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar172 = auVar79._0_4_;
              fVar224 = auVar10._0_4_;
            }
            auVar10 = vdpps_avx(_local_920,auVar240,0x7f);
            local_860._0_4_ =
                 ((float)local_a00._0_4_ / fVar172) * (fVar151 + 1.0) +
                 fVar224 + fVar151 * (float)local_a00._0_4_;
            auVar79 = vdpps_avx(local_a80._0_16_,auVar240,0x7f);
            auVar130 = vdpps_avx(_local_920,auVar163,0x7f);
            auVar157 = vdpps_avx(_local_aa0,auVar240,0x7f);
            auVar73 = vdpps_avx(_local_920,local_a80._0_16_,0x7f);
            fVar151 = auVar79._0_4_ + auVar130._0_4_;
            fVar172 = auVar10._0_4_;
            auVar83._0_4_ = fVar172 * fVar172;
            auVar83._4_4_ = auVar10._4_4_ * auVar10._4_4_;
            auVar83._8_4_ = auVar10._8_4_ * auVar10._8_4_;
            auVar83._12_4_ = auVar10._12_4_ * auVar10._12_4_;
            auVar130 = vsubps_avx(auVar84,auVar83);
            local_a80._0_16_ = ZEXT416((uint)fVar151);
            auVar79 = vdpps_avx(_local_920,_local_aa0,0x7f);
            fVar226 = auVar73._0_4_ - fVar172 * fVar151;
            fVar172 = auVar79._0_4_ - fVar172 * auVar157._0_4_;
            auVar79 = vrsqrtss_avx(auVar130,auVar130);
            fVar174 = auVar130._0_4_;
            fVar151 = auVar79._0_4_;
            fVar151 = fVar151 * 1.5 + fVar174 * -0.5 * fVar151 * fVar151 * fVar151;
            if (fVar174 < 0.0) {
              local_9c0._0_16_ = auVar10;
              local_9e0._0_16_ = auVar157;
              local_940._0_4_ = fVar226;
              local_820._0_4_ = fVar172;
              local_6e0._0_4_ = fVar151;
              fVar174 = sqrtf(fVar174);
              fVar151 = (float)local_6e0._0_4_;
              fVar226 = (float)local_940._0_4_;
              fVar172 = (float)local_820._0_4_;
              auVar157 = local_9e0._0_16_;
              auVar10 = local_9c0._0_16_;
              fVar224 = (float)local_9a0._0_4_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar130,auVar130);
              fVar174 = auVar79._0_4_;
            }
            auVar294 = ZEXT3264(local_880);
            auVar306 = ZEXT3264(local_8a0);
            auVar317 = ZEXT3264(local_8c0);
            auVar287 = ZEXT3264(local_8e0);
            auVar73 = vpermilps_avx(local_800._0_16_,0xff);
            auVar74 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
            fVar226 = fVar226 * fVar151 - auVar74._0_4_;
            auVar191._0_8_ = auVar157._0_8_ ^ 0x8000000080000000;
            auVar191._8_4_ = auVar157._8_4_ ^ 0x80000000;
            auVar191._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar216._0_4_ = -fVar226;
            auVar216._4_4_ = 0x80000000;
            auVar216._8_4_ = 0x80000000;
            auVar216._12_4_ = 0x80000000;
            auVar79 = vinsertps_avx(auVar216,ZEXT416((uint)(fVar172 * fVar151)),0x1c);
            auVar157 = vmovsldup_avx(ZEXT416((uint)(local_a80._0_4_ * fVar172 * fVar151 -
                                                   auVar157._0_4_ * fVar226)));
            auVar79 = vdivps_avx(auVar79,auVar157);
            auVar130 = vinsertps_avx(local_a80._0_16_,auVar191,0x10);
            auVar130 = vdivps_avx(auVar130,auVar157);
            auVar157 = vmovsldup_avx(auVar10);
            auVar81 = ZEXT416((uint)(fVar174 - auVar73._0_4_));
            auVar73 = vmovsldup_avx(auVar81);
            auVar133._0_4_ = auVar157._0_4_ * auVar79._0_4_ + auVar73._0_4_ * auVar130._0_4_;
            auVar133._4_4_ = auVar157._4_4_ * auVar79._4_4_ + auVar73._4_4_ * auVar130._4_4_;
            auVar133._8_4_ = auVar157._8_4_ * auVar79._8_4_ + auVar73._8_4_ * auVar130._8_4_;
            auVar133._12_4_ = auVar157._12_4_ * auVar79._12_4_ + auVar73._12_4_ * auVar130._12_4_;
            auVar79 = vsubps_avx(auVar238,auVar133);
            auVar245 = ZEXT1664(auVar79);
            auVar134._8_4_ = 0x7fffffff;
            auVar134._0_8_ = 0x7fffffff7fffffff;
            auVar134._12_4_ = 0x7fffffff;
            auVar238 = vandps_avx(auVar10,auVar134);
          } while ((float)local_860._0_4_ <= auVar238._0_4_);
          auVar164._8_4_ = 0x7fffffff;
          auVar164._0_8_ = 0x7fffffff7fffffff;
          auVar164._12_4_ = 0x7fffffff;
          auVar238 = vandps_avx(auVar81,auVar164);
        } while ((float)local_700._0_4_ * 1.9073486e-06 + fVar224 + (float)local_860._0_4_ <=
                 auVar238._0_4_);
        fVar151 = auVar79._0_4_ + (float)local_7e0._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar151) &&
           (fVar224 = (ray->super_RayK<1>).tfar, fVar151 <= fVar224)) {
          auVar238 = vmovshdup_avx(auVar79);
          fVar172 = auVar238._0_4_;
          if ((0.0 <= fVar172) && (fVar172 <= 1.0)) {
            auVar84 = vrsqrtss_avx(auVar84,auVar84);
            fVar226 = auVar84._0_4_;
            pGVar7 = (context->scene->geometries).items[uVar67].ptr;
            if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar84 = ZEXT416((uint)(fVar226 * 1.5 + fVar208 * -0.5 * fVar226 * fVar226 * fVar226)
                               );
              auVar84 = vshufps_avx(auVar84,auVar84,0);
              auVar165._0_4_ = auVar84._0_4_ * (float)local_920._0_4_;
              auVar165._4_4_ = auVar84._4_4_ * (float)local_920._4_4_;
              auVar165._8_4_ = auVar84._8_4_ * fStack_918;
              auVar165._12_4_ = auVar84._12_4_ * fStack_914;
              auVar105._0_4_ = local_a60._0_4_ + auVar74._0_4_ * auVar165._0_4_;
              auVar105._4_4_ = local_a60._4_4_ + auVar74._4_4_ * auVar165._4_4_;
              auVar105._8_4_ = local_a60._8_4_ + auVar74._8_4_ * auVar165._8_4_;
              auVar105._12_4_ = local_a60._12_4_ + auVar74._12_4_ * auVar165._12_4_;
              auVar84 = vshufps_avx(auVar165,auVar165,0xc9);
              auVar238 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
              auVar166._0_4_ = auVar238._0_4_ * auVar165._0_4_;
              auVar166._4_4_ = auVar238._4_4_ * auVar165._4_4_;
              auVar166._8_4_ = auVar238._8_4_ * auVar165._8_4_;
              auVar166._12_4_ = auVar238._12_4_ * auVar165._12_4_;
              auVar192._0_4_ = local_a60._0_4_ * auVar84._0_4_;
              auVar192._4_4_ = local_a60._4_4_ * auVar84._4_4_;
              auVar192._8_4_ = local_a60._8_4_ * auVar84._8_4_;
              auVar192._12_4_ = local_a60._12_4_ * auVar84._12_4_;
              auVar10 = vsubps_avx(auVar192,auVar166);
              auVar84 = vshufps_avx(auVar10,auVar10,0xc9);
              auVar238 = vshufps_avx(auVar105,auVar105,0xc9);
              auVar193._0_4_ = auVar238._0_4_ * auVar84._0_4_;
              auVar193._4_4_ = auVar238._4_4_ * auVar84._4_4_;
              auVar193._8_4_ = auVar238._8_4_ * auVar84._8_4_;
              auVar193._12_4_ = auVar238._12_4_ * auVar84._12_4_;
              auVar84 = vshufps_avx(auVar10,auVar10,0xd2);
              auVar106._0_4_ = auVar105._0_4_ * auVar84._0_4_;
              auVar106._4_4_ = auVar105._4_4_ * auVar84._4_4_;
              auVar106._8_4_ = auVar105._8_4_ * auVar84._8_4_;
              auVar106._12_4_ = auVar105._12_4_ * auVar84._12_4_;
              auVar238 = vsubps_avx(auVar193,auVar106);
              auVar84 = vshufps_avx(auVar238,auVar238,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar151;
                uVar2 = vmovlps_avx(auVar84);
                *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                (ray->Ng).field_0.field_0.z = auVar238._0_4_;
                ray->u = fVar172;
                ray->v = 0.0;
                ray->primID = local_840._0_4_;
                ray->geomID = uVar67;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_970 = vmovlps_avx(auVar84);
                local_968 = auVar238._0_4_;
                local_964 = fVar172;
                local_960 = 0;
                local_95c = local_840._0_4_;
                local_958 = uVar67;
                local_954 = context->user->instID[0];
                local_950 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar151;
                local_aa4 = -1;
                local_ad8.valid = &local_aa4;
                local_ad8.geometryUserPtr = pGVar7->userPtr;
                local_ad8.context = context->user;
                local_ad8.hit = (RTCHitN *)&local_970;
                local_ad8.N = 1;
                local_ad8.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007d7c04:
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&local_ad8);
                    auVar287 = ZEXT3264(local_8e0);
                    auVar317 = ZEXT3264(local_8c0);
                    auVar306 = ZEXT3264(local_8a0);
                    auVar294 = ZEXT3264(local_880);
                    if (*local_ad8.valid == 0) goto LAB_007d7cb9;
                  }
                  (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).components[0] =
                       *(float *)local_ad8.hit;
                  (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_ad8.hit + 4);
                  (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_ad8.hit + 8);
                  *(float *)((long)local_ad8.ray + 0x3c) = *(float *)(local_ad8.hit + 0xc);
                  *(float *)((long)local_ad8.ray + 0x40) = *(float *)(local_ad8.hit + 0x10);
                  *(float *)((long)local_ad8.ray + 0x44) = *(float *)(local_ad8.hit + 0x14);
                  *(float *)((long)local_ad8.ray + 0x48) = *(float *)(local_ad8.hit + 0x18);
                  *(float *)((long)local_ad8.ray + 0x4c) = *(float *)(local_ad8.hit + 0x1c);
                  *(float *)((long)local_ad8.ray + 0x50) = *(float *)(local_ad8.hit + 0x20);
                }
                else {
                  (*pGVar7->intersectionFilterN)(&local_ad8);
                  auVar287 = ZEXT3264(local_8e0);
                  auVar317 = ZEXT3264(local_8c0);
                  auVar306 = ZEXT3264(local_8a0);
                  auVar294 = ZEXT3264(local_880);
                  if (*local_ad8.valid != 0) goto LAB_007d7c04;
LAB_007d7cb9:
                  (ray->super_RayK<1>).tfar = fVar224;
                }
              }
            }
          }
        }
LAB_007d7adc:
        fVar208 = (ray->super_RayK<1>).tfar;
        auVar118._4_4_ = fVar208;
        auVar118._0_4_ = fVar208;
        auVar118._8_4_ = fVar208;
        auVar118._12_4_ = fVar208;
        auVar118._16_4_ = fVar208;
        auVar118._20_4_ = fVar208;
        auVar118._24_4_ = fVar208;
        auVar118._28_4_ = fVar208;
        auVar107 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        auVar283 = vcmpps_avx(_local_740,auVar118,2);
        auVar283 = vandps_avx(auVar283,local_640);
      }
      auVar283 = vandps_avx(local_680,_local_6c0);
      auVar333 = vandps_avx(_local_7a0,local_6a0);
      auVar245 = ZEXT3264(_local_660);
      auVar198._0_4_ = local_660._0_4_ + local_560._0_4_;
      auVar198._4_4_ = local_660._4_4_ + local_560._4_4_;
      auVar198._8_4_ = local_660._8_4_ + local_560._8_4_;
      auVar198._12_4_ = local_660._12_4_ + local_560._12_4_;
      auVar198._16_4_ = local_660._16_4_ + local_560._16_4_;
      auVar198._20_4_ = local_660._20_4_ + local_560._20_4_;
      auVar198._24_4_ = local_660._24_4_ + local_560._24_4_;
      auVar198._28_4_ = local_660._28_4_ + local_560._28_4_;
      auVar84 = vshufps_avx(auVar107._0_16_,auVar107._0_16_,0);
      auVar222._16_16_ = auVar84;
      auVar222._0_16_ = auVar84;
      auVar107 = vcmpps_avx(auVar198,auVar222,2);
      auVar107 = vandps_avx(auVar107,auVar283);
      auVar199._0_4_ = local_660._0_4_ + local_5a0._0_4_;
      auVar199._4_4_ = local_660._4_4_ + local_5a0._4_4_;
      auVar199._8_4_ = local_660._8_4_ + local_5a0._8_4_;
      auVar199._12_4_ = local_660._12_4_ + local_5a0._12_4_;
      auVar199._16_4_ = local_660._16_4_ + local_5a0._16_4_;
      auVar199._20_4_ = local_660._20_4_ + local_5a0._20_4_;
      auVar199._24_4_ = local_660._24_4_ + local_5a0._24_4_;
      auVar199._28_4_ = local_660._28_4_ + local_5a0._28_4_;
      auVar283 = vcmpps_avx(auVar199,auVar222,2);
      auVar283 = vandps_avx(auVar283,auVar333);
      auVar283 = vorps_avx(auVar107,auVar283);
      if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar283 >> 0x7f,0) != '\0') ||
            (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar283 >> 0xbf,0) != '\0') ||
          (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar283[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar69 * 0x60) = auVar283;
        auVar107 = vblendvps_avx(_local_5a0,local_560,auVar107);
        *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x60) = auVar107;
        uVar65 = vmovlps_avx(local_5b0);
        (&uStack_140)[uVar69 * 0xc] = uVar65;
        auStack_138[uVar69 * 0x18] = local_b2c + 1;
        uVar69 = (ulong)((int)uVar69 + 1);
      }
      auVar260 = auVar294._0_32_;
      auVar136 = auVar306._0_32_;
      auVar286 = auVar287._0_32_;
    }
    auVar333 = local_360;
    auVar344 = local_380;
    auVar283 = local_4e0;
    fVar208 = (ray->super_RayK<1>).tfar;
    auVar139._4_4_ = fVar208;
    auVar139._0_4_ = fVar208;
    auVar139._8_4_ = fVar208;
    auVar139._12_4_ = fVar208;
    auVar139._16_4_ = fVar208;
    auVar139._20_4_ = fVar208;
    auVar139._24_4_ = fVar208;
    auVar139._28_4_ = fVar208;
    while( true ) {
      uVar68 = (uint)uVar69;
      if (uVar68 == 0) {
        auVar84 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
        auVar84 = vshufps_avx(auVar84,auVar84,0);
        auVar84 = vcmpps_avx(local_5c0,auVar84,2);
        uVar67 = vmovmskps_avx(auVar84);
        uVar63 = (ulong)((uint)uVar63 - 1 & (uint)uVar63 & uVar67);
        goto LAB_007d56a9;
      }
      uVar65 = (ulong)(uVar68 - 1);
      lVar64 = uVar65 * 0x60;
      auVar107 = *(undefined1 (*) [32])(auStack_160 + lVar64);
      auVar111._0_4_ = auVar107._0_4_ + (float)local_660._0_4_;
      auVar111._4_4_ = auVar107._4_4_ + (float)local_660._4_4_;
      auVar111._8_4_ = auVar107._8_4_ + fStack_658;
      auVar111._12_4_ = auVar107._12_4_ + fStack_654;
      auVar111._16_4_ = auVar107._16_4_ + fStack_650;
      auVar111._20_4_ = auVar107._20_4_ + fStack_64c;
      auVar111._24_4_ = auVar107._24_4_ + fStack_648;
      auVar111._28_4_ = auVar107._28_4_ + fStack_644;
      auVar11 = vcmpps_avx(auVar111,auVar139,2);
      auVar169 = vandps_avx(auVar11,*(undefined1 (*) [32])(auStack_180 + lVar64));
      local_560 = auVar169;
      auVar11 = *(undefined1 (*) [32])(auStack_180 + lVar64) & auVar11;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') break;
      uVar69 = (ulong)(uVar68 - 1);
    }
    auVar89._8_4_ = 0x7f800000;
    auVar89._0_8_ = 0x7f8000007f800000;
    auVar89._12_4_ = 0x7f800000;
    auVar89._16_4_ = 0x7f800000;
    auVar89._20_4_ = 0x7f800000;
    auVar89._24_4_ = 0x7f800000;
    auVar89._28_4_ = 0x7f800000;
    auVar107 = vblendvps_avx(auVar89,auVar107,auVar169);
    auVar11 = vshufps_avx(auVar107,auVar107,0xb1);
    auVar11 = vminps_avx(auVar107,auVar11);
    auVar12 = vshufpd_avx(auVar11,auVar11,5);
    auVar11 = vminps_avx(auVar11,auVar12);
    auVar12 = vperm2f128_avx(auVar11,auVar11,1);
    auVar11 = vminps_avx(auVar11,auVar12);
    auVar107 = vcmpps_avx(auVar107,auVar11,0);
    auVar11 = auVar169 & auVar107;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar169 = vandps_avx(auVar107,auVar169);
    }
    auVar77._8_8_ = 0;
    auVar77._0_8_ = (&uStack_140)[uVar65 * 0xc];
    local_b2c = auStack_138[uVar65 * 0x18];
    uVar66 = vmovmskps_avx(auVar169);
    uVar62 = 0;
    if (uVar66 != 0) {
      for (; (uVar66 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
      }
    }
    *(undefined4 *)(local_560 + (ulong)uVar62 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar64) = local_560;
    uVar66 = uVar68 - 1;
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_560 >> 0x7f,0) != '\0') ||
          (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_560 >> 0xbf,0) != '\0') ||
        (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_560[0x1f] < '\0') {
      uVar66 = uVar68;
    }
    auVar84 = vshufps_avx(auVar77,auVar77,0);
    auVar238 = vshufps_avx(auVar77,auVar77,0x55);
    auVar238 = vsubps_avx(auVar238,auVar84);
    local_5a0._4_4_ = auVar84._4_4_ + auVar238._4_4_ * 0.14285715;
    local_5a0._0_4_ = auVar84._0_4_ + auVar238._0_4_ * 0.0;
    fStack_598 = auVar84._8_4_ + auVar238._8_4_ * 0.2857143;
    fStack_594 = auVar84._12_4_ + auVar238._12_4_ * 0.42857146;
    fStack_590 = auVar84._0_4_ + auVar238._0_4_ * 0.5714286;
    fStack_58c = auVar84._4_4_ + auVar238._4_4_ * 0.71428573;
    fStack_588 = auVar84._8_4_ + auVar238._8_4_ * 0.8571429;
    fStack_584 = auVar84._12_4_ + auVar238._12_4_;
    local_5b0._8_8_ = 0;
    local_5b0._0_8_ = *(ulong *)(local_5a0 + (ulong)uVar62 * 4);
    uVar69 = (ulong)uVar66;
    uVar65 = local_840._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }